

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Extrapolater.cpp
# Opt level: O1

void amrex::Extrapolater::FirstOrderExtrap
               (MultiFab *mf,Geometry *geom,int scomp,int ncomp,int ngrow)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar11;
  int *piVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  undefined8 *puVar18;
  long lVar20;
  long lVar21;
  int *piVar22;
  double *pdVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  double dVar40;
  Periodicity PVar41;
  MFIter mfi;
  iMultiFab mask;
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  Array4<double> local_660;
  long local_620;
  long local_618;
  int local_60c;
  long local_608;
  long local_600;
  long local_5f8;
  int local_5ec;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  ulong local_5d0;
  long local_5c8;
  ulong local_5c0;
  int local_5b8;
  int local_5b4;
  long local_5b0;
  long local_5a8;
  Array4<const_int> local_5a0;
  ulong local_560;
  ulong local_558;
  ulong local_550;
  ulong local_548;
  ulong local_540;
  long local_538;
  long local_530;
  double *local_528;
  long local_520;
  long local_518;
  long local_510;
  long local_508;
  long local_500;
  long local_4f8;
  ulong local_4f0;
  undefined **local_4e8;
  long local_4e0;
  long local_4d8;
  long local_4d0;
  long local_4c8;
  ulong local_4c0;
  long local_4b8;
  ulong local_4b0;
  long local_4a8;
  int local_49c;
  long local_498;
  long local_490;
  long local_488;
  long local_480;
  long local_478;
  long local_470;
  long local_468;
  long local_460;
  long local_458;
  long local_450;
  int local_448;
  int local_444;
  long local_440;
  long local_438;
  long local_430;
  long local_428;
  long local_420;
  long local_418;
  ulong local_410;
  long local_408;
  long local_400;
  uint local_3f4;
  uint local_3f0;
  int local_3ec;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  double *local_3a0;
  double *local_398;
  double *local_390;
  long local_388;
  long local_380;
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  FabArray<amrex::FArrayBox> *local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  double *local_330;
  double *local_328;
  double *local_320;
  long local_318;
  long local_310;
  double *local_308;
  double *local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  long local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double *local_268;
  long local_260;
  long local_258;
  ulong local_250;
  long local_248;
  long local_240;
  Box local_234;
  undefined1 local_218 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  int local_1f0;
  Vector<int,_std::allocator<int>_> *local_1e0;
  FabArray<amrex::IArrayBox> local_1b0;
  int iVar10;
  ulong uVar19;
  
  local_218._1_7_ = 0;
  local_218[0] = true;
  local_218._8_4_ = 0;
  local_218._12_4_ = 0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a0.p = (int *)&PTR__FabFactory_0074f4c0;
  local_3f4 = ngrow;
  local_3f0 = ncomp;
  local_378 = scomp;
  local_360 = &mf->super_FabArray<amrex::FArrayBox>;
  iMultiFab::iMultiFab
            ((iMultiFab *)&local_1b0,
             &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,ngrow,
             (MFInfo *)local_218,(FabFactory<amrex::IArrayBox> *)&local_5a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  PVar41 = Geometry::periodicity(geom);
  local_218[0] = PVar41.period.vect[0]._0_1_;
  local_218._1_7_ = PVar41.period.vect._1_7_;
  local_218._8_4_ = PVar41.period.vect[2];
  FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
            (&local_1b0,&geom->domain,(Periodicity *)local_218,1,0,0,1);
  if (0 < (int)local_3f4) {
    local_250 = (ulong)local_3f0;
    local_3a8 = 0xffffffff;
    local_3b0 = 0;
    local_4f0 = 1;
    local_3b8 = 1;
    local_3c0 = 0;
    do {
      MFIter::MFIter((MFIter *)local_218,&local_360->super_FabArrayBase,'\0');
      if ((int)local_208.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1f0) {
        do {
          BATransformer::operator()
                    (&local_234,(BATransformer *)(CONCAT44(local_218._12_4_,local_218._8_4_) + 8),
                     (Box *)((long)(local_1e0->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start
                                   [(int)local_208.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage] * 0x1c
                            + **(long **)(CONCAT44(local_218._12_4_,local_218._8_4_) + 0x50)));
          iVar5 = local_234.bigend.vect[2];
          iVar1 = local_234.bigend.vect[1];
          iVar15 = local_234.bigend.vect[0];
          iVar11 = local_234.smallend.vect[2];
          iVar27 = local_234.smallend.vect[0];
          local_4b0 = (ulong)(uint)local_234.smallend.vect[1];
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    (&local_5a0,&local_1b0,(MFIter *)local_218);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_660,local_360,(MFIter *)local_218,local_378);
          if (0 < (int)local_3f0) {
            iVar13 = (int)local_3c0;
            uVar33 = iVar27 - iVar13;
            local_4c0 = (ulong)uVar33;
            uVar24 = iVar11 - iVar13;
            local_540 = (ulong)uVar24;
            uVar6 = iVar13 + iVar5;
            local_560 = (ulong)uVar6;
            local_444 = uVar24 - 1;
            local_448 = uVar33 - 1;
            local_5ec = uVar6 + 1;
            local_408 = (local_444 - local_5a0.begin.z) * local_5a0.kstride;
            local_488 = (int)(uVar24 - local_5a0.begin.z) * local_5a0.kstride;
            local_388 = (local_5ec - local_5a0.begin.z) * local_5a0.kstride;
            local_430 = (int)(uVar6 - local_5a0.begin.z) * local_5a0.kstride;
            iVar10 = (int)local_4b0;
            uVar9 = iVar10 - iVar13;
            local_550 = (ulong)uVar9;
            local_5b4 = uVar9 - 1;
            uVar7 = iVar1 + iVar13;
            local_558 = (ulong)uVar7;
            local_5b8 = uVar7 + 1;
            lVar20 = (local_5b4 - local_5a0.begin.y) * local_5a0.jstride;
            lVar28 = (int)(uVar9 - local_5a0.begin.y) * local_5a0.jstride;
            lVar37 = (local_5b8 - local_5a0.begin.y) * local_5a0.jstride;
            lVar36 = (int)(uVar7 - local_5a0.begin.y) * local_5a0.jstride;
            uVar30 = iVar15 + iVar13;
            local_5c0 = (ulong)uVar30;
            local_60c = uVar30 + 1;
            lVar25 = (long)(local_448 - local_5a0.begin.x);
            local_4e8 = (undefined **)local_5a0.p;
            lVar34 = (long)(int)(uVar33 - local_5a0.begin.x);
            local_418 = (long)local_5a0.p + lVar25 * 4 + lVar37 * 4;
            local_438 = (long)local_5a0.p + lVar34 * 4 + lVar37 * 4;
            local_420 = (long)local_5a0.p + lVar25 * 4 + lVar20 * 4;
            local_490 = (long)local_5a0.p + lVar25 * 4 + lVar28 * 4;
            local_498 = (long)local_5a0.p + lVar25 * 4 + lVar36 * 4;
            local_350 = (long)local_5a0.p + lVar34 * 4 + lVar36 * 4;
            local_440 = (long)local_5a0.p + lVar34 * 4 + lVar20 * 4;
            local_358 = (long)local_5a0.p + lVar34 * 4 + lVar28 * 4;
            local_380 = (long)local_5a0.p + (long)(local_60c - local_5a0.begin.x) * 4 + lVar20 * 4;
            local_260 = (long)local_5a0.p + (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar20 * 4
            ;
            local_348 = (long)local_5a0.p + (long)(local_60c - local_5a0.begin.x) * 4 + lVar28 * 4;
            local_2b0 = (long)local_5a0.p + (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar28 * 4
            ;
            local_4c8 = (long)(int)uVar7;
            lVar26 = (int)(uVar9 - local_660.begin.y) * local_660.jstride;
            lVar21 = (local_5b4 - local_660.begin.y) * local_660.jstride;
            lVar36 = (int)(uVar7 - local_660.begin.y) * local_660.jstride;
            lVar31 = (local_5b8 - local_660.begin.y) * local_660.jstride;
            lVar20 = (long)(int)(uVar33 - local_660.begin.x);
            lVar28 = (long)(local_448 - local_660.begin.x);
            local_528 = local_660.p;
            local_300 = local_660.p + lVar36 + lVar20;
            local_308 = local_660.p + lVar31 + lVar28;
            lVar25 = (int)(uVar24 - local_660.begin.z) * local_660.kstride;
            lVar34 = (local_444 - local_660.begin.z) * local_660.kstride;
            local_310 = (long)(int)(uVar6 - local_660.begin.z);
            lVar16 = local_660.kstride * local_310;
            local_318 = (long)(local_5ec - local_660.begin.z);
            lVar37 = local_660.kstride * local_318;
            local_320 = local_660.p + lVar26 + lVar20 + lVar25;
            local_2b8 = local_660.p + lVar26 + lVar20 + lVar34;
            local_328 = local_660.p + lVar26 + lVar20 + lVar16;
            local_2c0 = local_660.p + lVar26 + lVar20 + lVar37;
            local_268 = local_660.p + lVar28 + lVar26 + lVar37;
            local_390 = local_660.p + lVar21 + lVar28 + lVar37;
            local_270 = local_660.p + lVar21 + lVar20 + lVar37;
            local_2c8 = local_660.p + lVar21 + lVar20 + lVar25;
            local_278 = local_660.p + lVar21 + lVar20 + lVar34;
            local_2d0 = local_660.p + lVar21 + lVar20 + lVar16;
            local_2d8 = local_660.p + lVar26 + lVar28 + lVar25;
            local_280 = local_660.p + lVar26 + lVar28 + lVar34;
            local_2e0 = local_660.p + lVar26 + lVar28 + lVar16;
            local_288 = local_660.p + lVar21 + lVar28 + lVar16;
            local_398 = local_660.p + lVar21 + lVar28 + lVar34;
            local_290 = local_660.p + lVar21 + lVar28 + lVar25;
            iVar13 = (int)local_3a8;
            local_530 = (long)(iVar13 + iVar10);
            local_508 = (long)(iVar13 + iVar11);
            iVar4 = (int)local_3b0;
            local_520 = (long)(iVar4 + iVar11);
            uVar8 = (uint)local_4f0;
            local_374 = (uVar8 + iVar5) - iVar11;
            local_410 = (ulong)(uint)(iVar11 - iVar5);
            iVar11 = (int)local_3b8;
            local_49c = iVar11 + iVar5;
            local_538 = (long)(iVar4 + iVar10);
            local_4b0 = (ulong)(uint)(iVar10 - iVar1);
            local_3ec = iVar1 + iVar11;
            local_2e8 = local_660.p + lVar31 + lVar20 + lVar25;
            local_298 = local_660.p + lVar31 + lVar20 + lVar34;
            local_3a0 = local_308 + lVar34;
            local_2f0 = local_300 + lVar34;
            local_2a0 = local_660.p + lVar36 + lVar28 + lVar34;
            local_2f8 = local_660.p + lVar36 + lVar28 + lVar25;
            local_330 = local_300 + lVar25;
            local_2a8 = local_308 + lVar25;
            local_510 = (long)(iVar13 + iVar27);
            local_518 = (long)(iVar11 + iVar15);
            uVar14 = (iVar15 + uVar8) - iVar27;
            local_548 = (ulong)uVar14;
            local_500 = (long)(iVar4 + iVar27);
            local_364 = *(int *)(local_420 + local_408 * 4);
            local_4b8 = local_660.nstride;
            local_368 = *(int *)(local_420 + local_388 * 4);
            local_4f8 = (long)(int)uVar30;
            local_4e0 = (long)(int)uVar6;
            local_36c = *(int *)(local_418 + local_408 * 4);
            local_370 = *(int *)(local_418 + local_388 * 4);
            local_248 = local_510 + -1;
            local_400 = local_510 * 4;
            local_428 = local_510 * 8;
            local_460 = (long)local_49c;
            local_468 = (long)local_3ec;
            local_338 = local_530 + -1;
            local_258 = local_518 * 4;
            local_340 = local_518 * 8;
            local_470 = local_520 + -1;
            local_3c8 = (long)local_5a0.p + local_510 * 4;
            local_3d0 = local_500 * 4;
            local_478 = (long)local_5a0.p + local_500 * 4;
            local_480 = local_520 + 1;
            local_3d8 = (long)local_5a0.p + local_518 * 4;
            local_3e0 = (long)local_5a0.p + local_4f8 * 4;
            local_4d0 = local_538 + -1;
            local_4d8 = local_538 + 1;
            local_4a8 = local_500 * 8;
            local_3e8 = (long)local_5a0.p + local_500 * 4 + 4;
            local_240 = local_4f8 * 8;
            local_5d8 = 0;
            local_5d0 = 0;
            do {
              if (local_5b4 <= local_5b8) {
                lVar25 = (long)local_5a0.p +
                         (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4 +
                         (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4 +
                         (long)local_5a0.begin.x * -4 + local_400;
                lVar20 = local_530;
                do {
                  if (local_448 <= local_60c) {
                    lVar28 = 0;
                    do {
                      if (*(int *)(lVar25 + lVar28 * 4) == 0) {
                        *(undefined8 *)
                         ((long)local_660.p +
                         lVar28 * 8 +
                         local_660.nstride * local_5d8 +
                         (local_508 - local_660.begin.z) * local_660.kstride * 8 +
                         (lVar20 - local_660.begin.y) * local_660.jstride * 8 +
                         (long)local_660.begin.x * -8 + local_428) = 0;
                      }
                      lVar34 = local_248 + lVar28;
                      lVar28 = lVar28 + 1;
                    } while (lVar34 + 1 <= local_4f8);
                  }
                  lVar25 = lVar25 + local_5a0.jstride * 4;
                  bVar2 = lVar20 <= local_4c8;
                  lVar20 = lVar20 + 1;
                } while (bVar2);
              }
              if (local_5b4 <= local_5b8) {
                lVar25 = (long)local_5a0.p +
                         (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4 +
                         (local_460 - local_5a0.begin.z) * local_5a0.kstride * 4 +
                         (long)local_5a0.begin.x * -4 + local_400;
                lVar20 = local_530;
                do {
                  if (local_448 <= local_60c) {
                    lVar28 = 0;
                    do {
                      if (*(int *)(lVar25 + lVar28 * 4) == 0) {
                        *(undefined8 *)
                         ((long)local_660.p +
                         lVar28 * 8 +
                         local_660.nstride * local_5d8 +
                         (local_460 - local_660.begin.z) * local_660.kstride * 8 +
                         (lVar20 - local_660.begin.y) * local_660.jstride * 8 +
                         (long)local_660.begin.x * -8 + local_428) = 0;
                      }
                      lVar34 = local_248 + lVar28;
                      lVar28 = lVar28 + 1;
                    } while (lVar34 + 1 <= local_4f8);
                  }
                  lVar25 = lVar25 + local_5a0.jstride * 4;
                  bVar2 = lVar20 <= local_4c8;
                  lVar20 = lVar20 + 1;
                } while (bVar2);
              }
              if (local_444 <= local_5ec) {
                lVar25 = (long)local_5a0.p +
                         (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4 +
                         (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4 +
                         (long)local_5a0.begin.x * -4 + local_400;
                lVar20 = local_508;
                do {
                  if (local_448 <= local_60c) {
                    lVar28 = 0;
                    do {
                      if (*(int *)(lVar25 + lVar28 * 4) == 0) {
                        *(undefined8 *)
                         ((long)local_660.p +
                         lVar28 * 8 +
                         local_660.nstride * local_5d8 +
                         (local_530 - local_660.begin.y) * local_660.jstride * 8 +
                         (lVar20 - local_660.begin.z) * local_660.kstride * 8 +
                         (long)local_660.begin.x * -8 + local_428) = 0;
                      }
                      lVar34 = local_248 + lVar28;
                      lVar28 = lVar28 + 1;
                    } while (lVar34 + 1 <= local_4f8);
                  }
                  lVar25 = lVar25 + local_5a0.kstride * 4;
                  bVar2 = lVar20 <= local_4e0;
                  lVar20 = lVar20 + 1;
                } while (bVar2);
              }
              if (local_444 <= local_5ec) {
                lVar25 = (long)local_5a0.p +
                         (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4 +
                         (local_468 - local_5a0.begin.y) * local_5a0.jstride * 4 +
                         (long)local_5a0.begin.x * -4 + local_400;
                lVar20 = local_508;
                do {
                  if (local_448 <= local_60c) {
                    lVar28 = 0;
                    do {
                      if (*(int *)(lVar25 + lVar28 * 4) == 0) {
                        *(undefined8 *)
                         ((long)local_660.p +
                         lVar28 * 8 +
                         local_660.nstride * local_5d8 +
                         (local_468 - local_660.begin.y) * local_660.jstride * 8 +
                         (lVar20 - local_660.begin.z) * local_660.kstride * 8 +
                         (long)local_660.begin.x * -8 + local_428) = 0;
                      }
                      lVar34 = local_248 + lVar28;
                      lVar28 = lVar28 + 1;
                    } while (lVar34 + 1 <= local_4f8);
                  }
                  lVar25 = lVar25 + local_5a0.kstride * 4;
                  bVar2 = lVar20 <= local_4e0;
                  lVar20 = lVar20 + 1;
                } while (bVar2);
              }
              if (local_444 <= local_5ec) {
                piVar12 = (int *)((long)local_5a0.p +
                                 (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4 +
                                 (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4 +
                                 (long)local_5a0.begin.x * -4 + local_400);
                lVar20 = local_508;
                do {
                  if (local_5b4 <= local_5b8) {
                    puVar18 = (undefined8 *)
                              ((long)local_660.p +
                              local_660.nstride * local_5d8 +
                              (local_530 - local_660.begin.y) * local_660.jstride * 8 +
                              (lVar20 - local_660.begin.z) * local_660.kstride * 8 +
                              (long)local_660.begin.x * -8 + local_428);
                    piVar22 = piVar12;
                    lVar25 = local_338;
                    do {
                      if (*piVar22 == 0) {
                        *puVar18 = 0;
                      }
                      lVar25 = lVar25 + 1;
                      piVar22 = piVar22 + local_5a0.jstride;
                      puVar18 = puVar18 + local_660.jstride;
                    } while (lVar25 <= local_4c8);
                  }
                  piVar12 = piVar12 + local_5a0.kstride;
                  bVar2 = lVar20 <= local_4e0;
                  lVar20 = lVar20 + 1;
                } while (bVar2);
              }
              if (local_444 <= local_5ec) {
                piVar12 = (int *)((long)local_5a0.p +
                                 (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4 +
                                 (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4 +
                                 (long)local_5a0.begin.x * -4 + local_258);
                lVar20 = local_508;
                do {
                  if (local_5b4 <= local_5b8) {
                    puVar18 = (undefined8 *)
                              ((long)local_660.p +
                              local_660.nstride * local_5d8 +
                              (local_530 - local_660.begin.y) * local_660.jstride * 8 +
                              (lVar20 - local_660.begin.z) * local_660.kstride * 8 +
                              (long)local_660.begin.x * -8 + local_340);
                    piVar22 = piVar12;
                    lVar25 = local_338;
                    do {
                      if (*piVar22 == 0) {
                        *puVar18 = 0;
                      }
                      lVar25 = lVar25 + 1;
                      piVar22 = piVar22 + local_5a0.jstride;
                      puVar18 = puVar18 + local_660.jstride;
                    } while (lVar25 <= local_4c8);
                  }
                  piVar12 = piVar12 + local_5a0.kstride;
                  bVar2 = lVar20 <= local_4e0;
                  lVar20 = lVar20 + 1;
                } while (bVar2);
              }
              if (local_364 == 0) {
                iVar27 = *(int *)(local_440 + local_408 * 4);
                if (((iVar27 == 1) || (*(int *)(local_490 + local_408 * 4) == 1)) ||
                   (*(int *)(local_420 + local_488 * 4) == 1)) {
                  iVar11 = *(int *)(local_490 + local_408 * 4);
                  dVar40 = (double)iVar11 * local_280[local_660.nstride * local_5d0];
                  dVar3 = (double)iVar27 * local_278[local_660.nstride * local_5d0];
                  iVar15 = *(int *)(local_420 + local_488 * 4);
                  pdVar23 = local_290;
                }
                else {
                  iVar27 = *(int *)(local_358 + local_408 * 4);
                  if (((iVar27 != 1) && (*(int *)(local_440 + local_488 * 4) != 1)) &&
                     (*(int *)(local_490 + local_488 * 4) != 1)) {
                    local_398[local_660.nstride * local_5d0] =
                         local_320[local_660.nstride * local_5d0];
                    goto LAB_00503a49;
                  }
                  iVar11 = *(int *)(local_440 + local_488 * 4);
                  dVar40 = (double)iVar11 * local_2c8[local_660.nstride * local_5d0];
                  dVar3 = (double)iVar27 * local_2b8[local_660.nstride * local_5d0];
                  iVar15 = *(int *)(local_490 + local_488 * 4);
                  pdVar23 = local_2d8;
                }
                local_398[local_660.nstride * local_5d0] =
                     ((double)iVar15 * pdVar23[local_660.nstride * local_5d0] + dVar3 + dVar40) /
                     (double)(iVar11 + iVar27 + iVar15);
              }
LAB_00503a49:
              if (local_368 == 0) {
                iVar27 = *(int *)(local_440 + local_388 * 4);
                if (((iVar27 == 1) || (*(int *)(local_490 + local_388 * 4) == 1)) ||
                   (*(int *)(local_420 + local_430 * 4) == 1)) {
                  iVar11 = *(int *)(local_490 + local_388 * 4);
                  dVar40 = (double)iVar11 * local_268[local_660.nstride * local_5d0];
                  dVar3 = (double)iVar27 * local_270[local_660.nstride * local_5d0];
                  iVar15 = *(int *)(local_420 + local_430 * 4);
                  pdVar23 = local_288;
                }
                else {
                  iVar27 = *(int *)(local_358 + local_388 * 4);
                  if (((iVar27 != 1) && (*(int *)(local_440 + local_430 * 4) != 1)) &&
                     (*(int *)(local_490 + local_430 * 4) != 1)) {
                    local_390[local_660.nstride * local_5d0] =
                         local_328[local_660.nstride * local_5d0];
                    goto LAB_00503b23;
                  }
                  iVar11 = *(int *)(local_440 + local_430 * 4);
                  dVar40 = (double)iVar11 * local_2d0[local_660.nstride * local_5d0];
                  dVar3 = (double)iVar27 * local_2c0[local_660.nstride * local_5d0];
                  iVar15 = *(int *)(local_490 + local_430 * 4);
                  pdVar23 = local_2e0;
                }
                local_390[local_660.nstride * local_5d0] =
                     ((double)iVar15 * pdVar23[local_660.nstride * local_5d0] + dVar3 + dVar40) /
                     (double)(iVar11 + iVar27 + iVar15);
              }
LAB_00503b23:
              if (local_36c == 0) {
                iVar27 = *(int *)(local_438 + local_408 * 4);
                if (((iVar27 == 1) || (*(int *)(local_498 + local_408 * 4) == 1)) ||
                   (*(int *)(local_418 + local_488 * 4) == 1)) {
                  iVar11 = *(int *)(local_498 + local_408 * 4);
                  dVar40 = (double)iVar11 * local_2a0[local_660.nstride * local_5d0];
                  dVar3 = (double)iVar27 * local_298[local_660.nstride * local_5d0];
                  iVar15 = *(int *)(local_418 + local_488 * 4);
                  pdVar23 = local_2a8;
                }
                else {
                  iVar27 = *(int *)(local_350 + local_408 * 4);
                  if (((iVar27 != 1) && (*(int *)(local_438 + local_488 * 4) != 1)) &&
                     (*(int *)(local_498 + local_488 * 4) != 1)) {
                    local_3a0[local_660.nstride * local_5d0] =
                         local_330[local_660.nstride * local_5d0];
                    goto LAB_00503bfa;
                  }
                  iVar11 = *(int *)(local_438 + local_488 * 4);
                  dVar40 = (double)iVar11 * local_2e8[local_660.nstride * local_5d0];
                  dVar3 = (double)iVar27 * local_2f0[local_660.nstride * local_5d0];
                  iVar15 = *(int *)(local_498 + local_488 * 4);
                  pdVar23 = local_2f8;
                }
                local_3a0[local_660.nstride * local_5d0] =
                     ((double)iVar15 * pdVar23[local_660.nstride * local_5d0] + dVar3 + dVar40) /
                     (double)(iVar11 + iVar27 + iVar15);
              }
LAB_00503bfa:
              if (local_370 == 0) {
                iVar27 = *(int *)(local_438 + local_388 * 4);
                if (((iVar27 == 1) || (*(int *)(local_498 + local_388 * 4) == 1)) ||
                   (*(int *)(local_418 + local_430 * 4) == 1)) {
                  lVar28 = (local_5b8 - local_660.begin.y) * local_660.jstride;
                  lVar20 = (local_5ec - local_660.begin.z) * local_660.kstride;
                  lVar25 = local_660.nstride * local_5d0;
                  iVar11 = *(int *)(local_498 + local_388 * 4);
                  lVar34 = (long)(local_448 - local_660.begin.x);
                  iVar15 = *(int *)(local_418 + local_430 * 4);
                  local_660.p[lVar28 + lVar34 + lVar20 + lVar25] =
                       ((double)iVar15 *
                        local_660.p
                        [lVar28 + lVar34 + (int)(uVar6 - local_660.begin.z) * local_660.kstride +
                                           lVar25] +
                       (double)iVar27 *
                       local_660.p
                       [lVar28 + (long)(int)(uVar33 - local_660.begin.x) + lVar20 + lVar25] +
                       (double)iVar11 *
                       local_660.p
                       [(int)(uVar7 - local_660.begin.y) * local_660.jstride +
                        lVar34 + lVar20 + lVar25]) / (double)(iVar11 + iVar27 + iVar15);
                }
                else {
                  iVar27 = *(int *)(local_350 + local_388 * 4);
                  if (((iVar27 == 1) || (*(int *)(local_438 + local_430 * 4) == 1)) ||
                     (*(int *)(local_498 + local_430 * 4) == 1)) {
                    lVar25 = (int)(uVar7 - local_660.begin.y) * local_660.jstride;
                    lVar20 = local_660.nstride * local_5d0;
                    iVar11 = *(int *)(local_438 + local_430 * 4);
                    lVar34 = (local_5b8 - local_660.begin.y) * local_660.jstride;
                    lVar36 = (int)(uVar6 - local_660.begin.z) * local_660.kstride;
                    lVar28 = (local_5ec - local_660.begin.z) * local_660.kstride;
                    iVar15 = *(int *)(local_498 + local_430 * 4);
                    local_660.p[lVar34 + (long)(local_448 - local_660.begin.x) + lVar28 + lVar20] =
                         ((double)iVar15 *
                          local_660.p
                          [lVar25 + (long)(local_448 - local_660.begin.x) + lVar36 + lVar20] +
                         (double)iVar27 *
                         local_660.p
                         [lVar25 + (long)(int)(uVar33 - local_660.begin.x) + lVar28 + lVar20] +
                         (double)iVar11 *
                         local_660.p
                         [lVar34 + (long)(int)(uVar33 - local_660.begin.x) + lVar36 + lVar20]) /
                         (double)(iVar11 + iVar27 + iVar15);
                  }
                  else {
                    local_308[local_660.kstride * local_318 + local_660.nstride * local_5d0] =
                         local_300[local_660.kstride * local_310 + local_660.nstride * local_5d0];
                  }
                }
              }
              if (*(int *)(local_380 + local_408 * 4) == 0) {
                iVar27 = *(int *)(local_260 + local_408 * 4);
                if (((iVar27 == 1) || (*(int *)(local_348 + local_408 * 4) == 1)) ||
                   (*(int *)(local_380 + local_488 * 4) == 1)) {
                  lVar28 = (local_5b4 - local_660.begin.y) * local_660.jstride;
                  lVar20 = (local_444 - local_660.begin.z) * local_660.kstride;
                  lVar25 = local_660.nstride * local_5d0;
                  iVar11 = *(int *)(local_348 + local_408 * 4);
                  lVar34 = (long)(local_60c - local_660.begin.x);
                  iVar15 = *(int *)(local_380 + local_488 * 4);
                  local_660.p[lVar28 + lVar34 + lVar20 + lVar25] =
                       ((double)iVar15 *
                        local_660.p
                        [lVar28 + lVar34 + (int)(uVar24 - local_660.begin.z) * local_660.kstride +
                                           lVar25] +
                       (double)iVar27 *
                       local_660.p
                       [lVar28 + (long)(int)(uVar30 - local_660.begin.x) + lVar20 + lVar25] +
                       (double)iVar11 *
                       local_660.p
                       [(int)(uVar9 - local_660.begin.y) * local_660.jstride +
                        lVar34 + lVar20 + lVar25]) / (double)(iVar11 + iVar27 + iVar15);
                }
                else if (((*(int *)(local_2b0 + local_408 * 4) == 1) ||
                         (lVar20 = ((long)(int)uVar24 - (long)local_5a0.begin.z) * local_5a0.kstride
                         , *(int *)((long)local_5a0.p +
                                   lVar20 * 4 +
                                   (long)(int)(uVar30 - local_5a0.begin.x) * 4 +
                                   (local_5b4 - local_5a0.begin.y) * local_5a0.jstride * 4) == 1))
                        || (*(int *)((long)local_5a0.p +
                                    lVar20 * 4 +
                                    (long)(local_60c - local_5a0.begin.x) * 4 +
                                    local_5a0.jstride * (int)(uVar9 - local_5a0.begin.y) * 4) == 1))
                {
                  lVar25 = (int)(uVar9 - local_5a0.begin.y) * local_5a0.jstride;
                  lVar16 = (local_444 - local_5a0.begin.z) * local_5a0.kstride;
                  lVar20 = (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar25 * 4;
                  lVar28 = (int)(uVar24 - local_5a0.begin.z) * local_5a0.kstride;
                  iVar27 = *(int *)((long)local_5a0.p +
                                   lVar28 * 4 +
                                   (long)(int)(uVar30 - local_5a0.begin.x) * 4 +
                                   (local_5b4 - local_5a0.begin.y) * local_5a0.jstride * 4);
                  iVar11 = *(int *)((long)local_5a0.p +
                                   lVar28 * 4 +
                                   (long)(local_60c - local_5a0.begin.x) * 4 + lVar25 * 4);
                  lVar25 = (int)(uVar9 - local_660.begin.y) * local_660.jstride;
                  lVar37 = (local_444 - local_660.begin.z) * local_660.kstride;
                  lVar34 = (local_5b4 - local_660.begin.y) * local_660.jstride;
                  lVar28 = local_660.nstride * local_5d0;
                  lVar36 = (int)(uVar24 - local_660.begin.z) * local_660.kstride;
                  local_660.p[lVar34 + (long)(local_60c - local_660.begin.x) + lVar37 + lVar28] =
                       ((double)iVar11 *
                        local_660.p
                        [lVar25 + (long)(local_60c - local_660.begin.x) + lVar36 + lVar28] +
                       (double)*(int *)((long)local_5a0.p + lVar16 * 4 + lVar20) *
                       local_660.p
                       [lVar25 + (long)(int)(uVar30 - local_660.begin.x) + lVar37 + lVar28] +
                       (double)iVar27 *
                       local_660.p
                       [lVar34 + (long)(int)(uVar30 - local_660.begin.x) + lVar36 + lVar28]) /
                       (double)(iVar11 + iVar27 + *(int *)((long)local_5a0.p + lVar16 * 4 + lVar20))
                  ;
                }
                else {
                  local_660.p
                  [(local_5b4 - local_660.begin.y) * local_660.jstride +
                   (long)(local_60c - local_660.begin.x) +
                   (local_444 - local_660.begin.z) * local_660.kstride +
                   local_660.nstride * local_5d0] =
                       local_660.p
                       [(int)(uVar9 - local_660.begin.y) * local_660.jstride +
                        (long)(int)(uVar30 - local_660.begin.x) +
                        (int)(uVar24 - local_660.begin.z) * local_660.kstride +
                        local_660.nstride * local_5d0];
                }
              }
              lVar28 = (long)(local_60c - local_5a0.begin.x);
              lVar25 = (local_5b4 - local_5a0.begin.y) * local_5a0.jstride;
              lVar34 = (local_5ec - local_5a0.begin.z) * local_5a0.kstride;
              lVar20 = lVar28 * 4 + lVar25 * 4;
              if (*(int *)((long)local_5a0.p + lVar34 * 4 + lVar20) == 0) {
                lVar25 = (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar25 * 4;
                iVar27 = *(int *)((long)local_5a0.p + lVar34 * 4 + lVar25);
                if (iVar27 != 1) {
                  lVar37 = (int)(uVar9 - local_5a0.begin.y) * local_5a0.jstride;
                  lVar36 = lVar28 * 4 + lVar37 * 4;
                  if ((*(int *)((long)local_5a0.p + lVar34 * 4 + lVar36) != 1) &&
                     (lVar16 = (int)(uVar6 - local_5a0.begin.z) * local_5a0.kstride,
                     *(int *)((long)local_5a0.p + lVar16 * 4 + lVar20) != 1)) {
                    iVar27 = *(int *)((long)local_5a0.p +
                                     lVar34 * 4 +
                                     (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar37 * 4);
                    if ((iVar27 == 1) ||
                       ((*(int *)((long)local_5a0.p + lVar16 * 4 + lVar25) == 1 ||
                        (*(int *)((long)local_5a0.p + lVar16 * 4 + lVar36) == 1)))) {
                      lVar28 = (int)(uVar9 - local_660.begin.y) * local_660.jstride;
                      lVar20 = local_660.nstride * local_5d0;
                      iVar11 = *(int *)((long)local_5a0.p + lVar16 * 4 + lVar25);
                      lVar25 = (local_5b4 - local_660.begin.y) * local_660.jstride;
                      lVar37 = (int)(uVar6 - local_660.begin.z) * local_660.kstride;
                      lVar34 = (local_5ec - local_660.begin.z) * local_660.kstride;
                      iVar15 = *(int *)((long)local_5a0.p + lVar16 * 4 + lVar36);
                      local_660.p[lVar25 + (long)(local_60c - local_660.begin.x) + lVar34 + lVar20]
                           = ((double)iVar15 *
                              local_660.p
                              [lVar28 + (long)(local_60c - local_660.begin.x) + lVar37 + lVar20] +
                             (double)iVar27 *
                             local_660.p
                             [lVar28 + (long)(int)(uVar30 - local_660.begin.x) + lVar34 + lVar20] +
                             (double)iVar11 *
                             local_660.p
                             [lVar25 + (long)(int)(uVar30 - local_660.begin.x) + lVar37 + lVar20]) /
                             (double)(iVar11 + iVar27 + iVar15);
                    }
                    else {
                      local_660.p
                      [(local_5b4 - local_660.begin.y) * local_660.jstride +
                       (long)(local_60c - local_660.begin.x) +
                       (local_5ec - local_660.begin.z) * local_660.kstride +
                       local_660.nstride * local_5d0] =
                           local_660.p
                           [(int)(uVar9 - local_660.begin.y) * local_660.jstride +
                            (long)(int)(uVar30 - local_660.begin.x) +
                            (int)(uVar6 - local_660.begin.z) * local_660.kstride +
                            local_660.nstride * local_5d0];
                    }
                    goto LAB_005040fd;
                  }
                }
                lVar36 = (local_5b4 - local_660.begin.y) * local_660.jstride;
                iVar11 = *(int *)((long)local_5a0.p +
                                 lVar34 * 4 +
                                 lVar28 * 4 +
                                 local_5a0.jstride * (int)(uVar9 - local_5a0.begin.y) * 4);
                lVar25 = (local_5ec - local_660.begin.z) * local_660.kstride;
                lVar28 = local_660.nstride * local_5d0;
                lVar34 = (long)(local_60c - local_660.begin.x);
                iVar15 = *(int *)((long)local_5a0.p +
                                 local_5a0.kstride * (int)(uVar6 - local_5a0.begin.z) * 4 + lVar20);
                local_660.p[lVar36 + lVar34 + lVar25 + lVar28] =
                     ((double)iVar15 *
                      local_660.p
                      [lVar36 + lVar34 + (int)(uVar6 - local_660.begin.z) * local_660.kstride +
                                         lVar28] +
                     (double)iVar27 *
                     local_660.p[lVar36 + (long)(int)(uVar30 - local_660.begin.x) + lVar25 + lVar28]
                     + (double)iVar11 *
                       local_660.p
                       [(int)(uVar9 - local_660.begin.y) * local_660.jstride +
                        lVar34 + lVar25 + lVar28]) / (double)(iVar11 + iVar27 + iVar15);
              }
LAB_005040fd:
              lVar28 = (long)(local_60c - local_5a0.begin.x);
              lVar25 = (local_5b8 - local_5a0.begin.y) * local_5a0.jstride;
              lVar34 = (local_444 - local_5a0.begin.z) * local_5a0.kstride;
              lVar20 = lVar28 * 4 + lVar25 * 4;
              if (*(int *)((long)local_5a0.p + lVar34 * 4 + lVar20) == 0) {
                lVar25 = (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar25 * 4;
                iVar27 = *(int *)((long)local_5a0.p + lVar34 * 4 + lVar25);
                if (iVar27 != 1) {
                  lVar37 = (int)(uVar7 - local_5a0.begin.y) * local_5a0.jstride;
                  lVar36 = lVar28 * 4 + lVar37 * 4;
                  if ((*(int *)((long)local_5a0.p + lVar34 * 4 + lVar36) != 1) &&
                     (lVar16 = (int)(uVar24 - local_5a0.begin.z) * local_5a0.kstride,
                     *(int *)((long)local_5a0.p + lVar16 * 4 + lVar20) != 1)) {
                    iVar27 = *(int *)((long)local_5a0.p +
                                     lVar34 * 4 +
                                     (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar37 * 4);
                    if ((iVar27 == 1) ||
                       ((*(int *)((long)local_5a0.p + lVar16 * 4 + lVar25) == 1 ||
                        (*(int *)((long)local_5a0.p + lVar16 * 4 + lVar36) == 1)))) {
                      lVar28 = (int)(uVar7 - local_660.begin.y) * local_660.jstride;
                      lVar20 = local_660.nstride * local_5d0;
                      iVar11 = *(int *)((long)local_5a0.p + lVar16 * 4 + lVar25);
                      lVar25 = (local_5b8 - local_660.begin.y) * local_660.jstride;
                      lVar37 = (int)(uVar24 - local_660.begin.z) * local_660.kstride;
                      lVar34 = (local_444 - local_660.begin.z) * local_660.kstride;
                      iVar15 = *(int *)((long)local_5a0.p + lVar16 * 4 + lVar36);
                      local_660.p[lVar25 + (long)(local_60c - local_660.begin.x) + lVar34 + lVar20]
                           = ((double)iVar15 *
                              local_660.p
                              [lVar28 + (long)(local_60c - local_660.begin.x) + lVar37 + lVar20] +
                             (double)iVar27 *
                             local_660.p
                             [lVar28 + (long)(int)(uVar30 - local_660.begin.x) + lVar34 + lVar20] +
                             (double)iVar11 *
                             local_660.p
                             [lVar25 + (long)(int)(uVar30 - local_660.begin.x) + lVar37 + lVar20]) /
                             (double)(iVar11 + iVar27 + iVar15);
                    }
                    else {
                      local_660.p
                      [(local_5b8 - local_660.begin.y) * local_660.jstride +
                       (long)(local_60c - local_660.begin.x) +
                       (local_444 - local_660.begin.z) * local_660.kstride +
                       local_660.nstride * local_5d0] =
                           local_660.p
                           [(int)(uVar7 - local_660.begin.y) * local_660.jstride +
                            (long)(int)(uVar30 - local_660.begin.x) +
                            (int)(uVar24 - local_660.begin.z) * local_660.kstride +
                            local_660.nstride * local_5d0];
                    }
                    goto LAB_00504320;
                  }
                }
                lVar36 = (local_5b8 - local_660.begin.y) * local_660.jstride;
                iVar11 = *(int *)((long)local_5a0.p +
                                 lVar34 * 4 +
                                 lVar28 * 4 +
                                 local_5a0.jstride * (int)(uVar7 - local_5a0.begin.y) * 4);
                lVar25 = (local_444 - local_660.begin.z) * local_660.kstride;
                lVar28 = local_660.nstride * local_5d0;
                lVar34 = (long)(local_60c - local_660.begin.x);
                iVar15 = *(int *)((long)local_5a0.p +
                                 local_5a0.kstride * (int)(uVar24 - local_5a0.begin.z) * 4 + lVar20)
                ;
                local_660.p[lVar36 + lVar34 + lVar25 + lVar28] =
                     ((double)iVar15 *
                      local_660.p
                      [lVar36 + lVar34 + (int)(uVar24 - local_660.begin.z) * local_660.kstride +
                                         lVar28] +
                     (double)iVar27 *
                     local_660.p[lVar36 + (long)(int)(uVar30 - local_660.begin.x) + lVar25 + lVar28]
                     + (double)iVar11 *
                       local_660.p
                       [(int)(uVar7 - local_660.begin.y) * local_660.jstride +
                        lVar34 + lVar25 + lVar28]) / (double)(iVar11 + iVar27 + iVar15);
              }
LAB_00504320:
              lVar28 = (long)(local_60c - local_5a0.begin.x);
              lVar25 = (local_5b8 - local_5a0.begin.y) * local_5a0.jstride;
              lVar34 = (local_5ec - local_5a0.begin.z) * local_5a0.kstride;
              lVar20 = lVar28 * 4 + lVar25 * 4;
              if (*(int *)((long)local_5a0.p + lVar34 * 4 + lVar20) == 0) {
                lVar25 = (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar25 * 4;
                iVar27 = *(int *)((long)local_5a0.p + lVar34 * 4 + lVar25);
                if (iVar27 != 1) {
                  lVar37 = (int)(uVar7 - local_5a0.begin.y) * local_5a0.jstride;
                  lVar36 = lVar28 * 4 + lVar37 * 4;
                  if ((*(int *)((long)local_5a0.p + lVar34 * 4 + lVar36) != 1) &&
                     (lVar16 = (int)(uVar6 - local_5a0.begin.z) * local_5a0.kstride,
                     *(int *)((long)local_5a0.p + lVar16 * 4 + lVar20) != 1)) {
                    iVar27 = *(int *)((long)local_5a0.p +
                                     lVar34 * 4 +
                                     (long)(int)(uVar30 - local_5a0.begin.x) * 4 + lVar37 * 4);
                    if ((iVar27 == 1) ||
                       ((*(int *)((long)local_5a0.p + lVar16 * 4 + lVar25) == 1 ||
                        (*(int *)((long)local_5a0.p + lVar16 * 4 + lVar36) == 1)))) {
                      lVar28 = (int)(uVar7 - local_660.begin.y) * local_660.jstride;
                      lVar20 = local_660.nstride * local_5d0;
                      iVar11 = *(int *)((long)local_5a0.p + lVar16 * 4 + lVar25);
                      lVar25 = (local_5b8 - local_660.begin.y) * local_660.jstride;
                      lVar37 = (int)(uVar6 - local_660.begin.z) * local_660.kstride;
                      lVar34 = (local_5ec - local_660.begin.z) * local_660.kstride;
                      iVar15 = *(int *)((long)local_5a0.p + lVar16 * 4 + lVar36);
                      local_660.p[lVar25 + (long)(local_60c - local_660.begin.x) + lVar34 + lVar20]
                           = ((double)iVar15 *
                              local_660.p
                              [lVar28 + (long)(local_60c - local_660.begin.x) + lVar37 + lVar20] +
                             (double)iVar27 *
                             local_660.p
                             [lVar28 + (long)(int)(uVar30 - local_660.begin.x) + lVar34 + lVar20] +
                             (double)iVar11 *
                             local_660.p
                             [lVar25 + (long)(int)(uVar30 - local_660.begin.x) + lVar37 + lVar20]) /
                             (double)(iVar11 + iVar27 + iVar15);
                    }
                    else {
                      local_660.p
                      [(local_5b8 - local_660.begin.y) * local_660.jstride +
                       (long)(local_60c - local_660.begin.x) +
                       (local_5ec - local_660.begin.z) * local_660.kstride +
                       local_660.nstride * local_5d0] =
                           local_660.p
                           [(int)(uVar7 - local_660.begin.y) * local_660.jstride +
                            (long)(int)(uVar30 - local_660.begin.x) +
                            (int)(uVar6 - local_660.begin.z) * local_660.kstride +
                            local_660.nstride * local_5d0];
                    }
                    goto LAB_00504514;
                  }
                }
                lVar36 = (local_5b8 - local_660.begin.y) * local_660.jstride;
                iVar11 = *(int *)((long)local_5a0.p +
                                 lVar34 * 4 +
                                 lVar28 * 4 +
                                 local_5a0.jstride * (int)(uVar7 - local_5a0.begin.y) * 4);
                lVar25 = (local_5ec - local_660.begin.z) * local_660.kstride;
                lVar28 = local_660.nstride * local_5d0;
                lVar34 = (long)(local_60c - local_660.begin.x);
                iVar15 = *(int *)((long)local_5a0.p +
                                 local_5a0.kstride * (int)(uVar6 - local_5a0.begin.z) * 4 + lVar20);
                local_660.p[lVar36 + lVar34 + lVar25 + lVar28] =
                     ((double)iVar15 *
                      local_660.p
                      [lVar36 + lVar34 + (int)(uVar6 - local_660.begin.z) * local_660.kstride +
                                         lVar28] +
                     (double)iVar27 *
                     local_660.p[lVar36 + (long)(int)(uVar30 - local_660.begin.x) + lVar25 + lVar28]
                     + (double)iVar11 *
                       local_660.p
                       [(int)(uVar7 - local_660.begin.y) * local_660.jstride +
                        lVar34 + lVar25 + lVar28]) / (double)(iVar11 + iVar27 + iVar15);
              }
LAB_00504514:
              if ((int)uVar24 <= (int)uVar6) {
                lVar28 = (long)local_5a0.begin.z;
                lVar20 = (long)local_660.begin.z;
                local_5a8 = local_660.kstride * 8;
                lVar34 = (local_470 - lVar20) * local_5a8;
                lVar25 = (local_538 - local_660.begin.y) * local_660.jstride * 8;
                local_620 = lVar25 + lVar34;
                lVar32 = (local_530 - local_660.begin.y) * local_660.jstride * 8;
                local_458 = local_5a0.kstride * 4;
                lVar38 = (local_470 - lVar28) * local_458;
                lVar35 = (local_538 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar29 = (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar39 = lVar38 + lVar29;
                lVar26 = (local_480 - lVar20) * local_5a8;
                lVar36 = (local_480 - lVar28) * local_458;
                lVar37 = lVar36 + lVar29;
                lVar31 = (local_520 - lVar28) * local_458;
                lVar29 = lVar31 + lVar29;
                lVar16 = (local_520 - lVar20) * local_5a8;
                lVar20 = local_660.nstride * local_5d8;
                lVar28 = (long)local_660.begin.x;
                lVar21 = lVar34 + lVar32 + lVar20 + lVar28 * -8;
                local_678 = lVar26 + lVar32 + lVar20 + lVar28 * -8;
                lVar34 = local_620 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_5f8 = lVar26 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_600 = (long)local_660.p + lVar21;
                lVar21 = lVar21 + (long)local_660.p;
                local_5e0 = (long)local_660.p + local_678;
                local_678 = local_678 + (long)local_660.p;
                lVar32 = lVar32 + lVar16 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar16 = lVar16 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar26 = (long)local_5a0.begin.x * -4;
                local_618 = lVar38 + lVar35 + local_3c8;
                lVar20 = local_478 + lVar39;
                lVar39 = lVar39 + local_3c8;
                local_668 = lVar36 + lVar35 + local_3c8;
                local_5c8 = local_478 + lVar37;
                lVar37 = lVar37 + local_3c8;
                lVar36 = lVar35 + lVar31 + local_3c8;
                lVar31 = local_478 + lVar29;
                lVar29 = lVar29 + local_3c8;
                lVar25 = lVar16;
                lVar28 = lVar32;
                iVar27 = local_374;
                do {
                  if (*(int *)(lVar29 + lVar26) == 0) {
                    iVar11 = *(int *)(lVar31 + lVar26);
                    local_608 = lVar21;
                    local_5e8 = lVar32;
                    local_5b0 = lVar29;
                    if ((((iVar11 == 1) || (*(int *)(lVar36 + lVar26) == 1)) ||
                        (*(int *)(lVar39 + lVar26) == 1)) || (*(int *)(lVar37 + lVar26) == 1)) {
                      *(double *)(lVar28 + local_510 * 8) =
                           ((double)*(int *)(lVar37 + lVar26) *
                            *(double *)(local_678 + local_510 * 8) +
                           (double)*(int *)(lVar39 + lVar26) * *(double *)(lVar21 + local_510 * 8) +
                           (double)iVar11 * *(double *)(lVar28 + local_500 * 8) +
                           (double)*(int *)(lVar36 + lVar26) * *(double *)(lVar16 + local_510 * 8))
                           / (double)(*(int *)(lVar39 + lVar26) + *(int *)(lVar37 + lVar26) +
                                     *(int *)(lVar36 + lVar26) + iVar11);
                      local_620 = lVar34;
                      local_450 = lVar20;
                    }
                    else {
                      *(double *)(lVar32 + local_510 * 8) =
                           ((double)*(int *)(local_668 + lVar26) *
                            *(double *)(local_5f8 + local_510 * 8) +
                           (double)*(int *)(local_618 + lVar26) *
                           *(double *)(lVar34 + local_510 * 8) +
                           (double)*(int *)(local_5c8 + lVar26) *
                           *(double *)(local_5e0 + local_500 * 8) +
                           (double)*(int *)(lVar20 + lVar26) *
                           *(double *)(local_600 + local_500 * 8) +
                           *(double *)(lVar25 + local_500 * 8)) /
                           (double)(*(int *)(local_668 + lVar26) +
                                    *(int *)(lVar20 + lVar26) + *(int *)(local_5c8 + lVar26) +
                                    *(int *)(local_618 + lVar26) + 1);
                    }
                  }
                  lVar34 = lVar34 + local_5a8;
                  local_600 = local_600 + local_5a8;
                  local_618 = local_618 + local_458;
                  lVar20 = lVar20 + local_458;
                  lVar39 = lVar39 + local_458;
                  local_5f8 = local_5f8 + local_5a8;
                  local_5e0 = local_5e0 + local_5a8;
                  local_668 = local_668 + local_458;
                  local_5c8 = local_5c8 + local_458;
                  lVar37 = lVar37 + local_458;
                  lVar21 = lVar21 + local_5a8;
                  local_678 = local_678 + local_5a8;
                  lVar36 = lVar36 + local_458;
                  lVar31 = lVar31 + local_458;
                  lVar29 = lVar29 + local_458;
                  lVar28 = lVar28 + local_5a8;
                  lVar16 = lVar16 + local_5a8;
                  lVar32 = lVar32 + local_5a8;
                  lVar25 = lVar25 + local_5a8;
                  iVar27 = iVar27 + -1;
                } while (iVar27 != 0);
              }
              if ((int)uVar24 <= (int)uVar6) {
                lVar28 = (long)local_5a0.begin.z;
                lVar20 = (long)local_660.begin.z;
                local_5a8 = local_660.kstride * 8;
                lVar34 = (local_470 - lVar20) * local_5a8;
                lVar25 = (local_4c8 - local_660.begin.y) * local_660.jstride * 8;
                lVar32 = (local_468 - local_660.begin.y) * local_660.jstride * 8;
                local_458 = local_5a0.kstride * 4;
                lVar38 = (local_470 - lVar28) * local_458;
                lVar35 = (local_4c8 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar29 = (local_468 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar39 = lVar38 + lVar29;
                lVar26 = (local_480 - lVar20) * local_5a8;
                lVar36 = (local_480 - lVar28) * local_458;
                lVar37 = lVar36 + lVar29;
                lVar31 = (local_520 - lVar28) * local_458;
                lVar29 = lVar31 + lVar29;
                lVar16 = (local_520 - lVar20) * local_5a8;
                lVar20 = local_660.nstride * local_5d8;
                lVar28 = (long)local_660.begin.x;
                lVar21 = lVar34 + lVar32 + lVar20 + lVar28 * -8;
                local_678 = lVar26 + lVar32 + lVar20 + lVar28 * -8;
                lVar34 = lVar25 + lVar34 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_5f8 = lVar26 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_600 = (long)local_660.p + lVar21;
                lVar21 = lVar21 + (long)local_660.p;
                local_5e0 = (long)local_660.p + local_678;
                local_678 = local_678 + (long)local_660.p;
                lVar32 = lVar32 + lVar16 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar16 = lVar16 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar26 = (long)local_5a0.begin.x * -4;
                local_668 = lVar38 + lVar35 + local_3c8;
                lVar20 = local_478 + lVar39;
                lVar39 = lVar39 + local_3c8;
                local_618 = lVar36 + lVar35 + local_3c8;
                local_5c8 = local_478 + lVar37;
                lVar37 = lVar37 + local_3c8;
                lVar36 = lVar35 + lVar31 + local_3c8;
                lVar31 = local_478 + lVar29;
                lVar29 = lVar29 + local_3c8;
                lVar25 = lVar16;
                uVar19 = local_410;
                lVar28 = lVar32;
                do {
                  if (*(int *)(lVar29 + lVar26) == 0) {
                    iVar27 = *(int *)(lVar31 + lVar26);
                    local_620 = lVar21;
                    local_608 = lVar32;
                    local_5e8 = lVar29;
                    if (((iVar27 == 1) || (*(int *)(lVar36 + lVar26) == 1)) ||
                       ((*(int *)(lVar39 + lVar26) == 1 || (*(int *)(lVar37 + lVar26) == 1)))) {
                      *(double *)(lVar28 + local_510 * 8) =
                           ((double)*(int *)(lVar37 + lVar26) *
                            *(double *)(local_678 + local_510 * 8) +
                           (double)*(int *)(lVar39 + lVar26) * *(double *)(lVar21 + local_510 * 8) +
                           (double)iVar27 * *(double *)(lVar28 + local_500 * 8) +
                           (double)*(int *)(lVar36 + lVar26) * *(double *)(lVar16 + local_510 * 8))
                           / (double)(*(int *)(lVar39 + lVar26) + *(int *)(lVar37 + lVar26) +
                                     *(int *)(lVar36 + lVar26) + iVar27);
                      local_5b0 = lVar34;
                      local_450 = lVar20;
                    }
                    else {
                      *(double *)(lVar32 + local_510 * 8) =
                           ((double)*(int *)(local_618 + lVar26) *
                            *(double *)(local_5f8 + local_510 * 8) +
                           (double)*(int *)(local_668 + lVar26) *
                           *(double *)(lVar34 + local_510 * 8) +
                           (double)*(int *)(local_5c8 + lVar26) *
                           *(double *)(local_5e0 + local_500 * 8) +
                           (double)*(int *)(lVar20 + lVar26) *
                           *(double *)(local_600 + local_500 * 8) +
                           *(double *)(lVar25 + local_500 * 8)) /
                           (double)(*(int *)(local_618 + lVar26) +
                                    *(int *)(lVar20 + lVar26) + *(int *)(local_5c8 + lVar26) +
                                    *(int *)(local_668 + lVar26) + 1);
                    }
                  }
                  lVar34 = lVar34 + local_5a8;
                  local_600 = local_600 + local_5a8;
                  local_668 = local_668 + local_458;
                  lVar20 = lVar20 + local_458;
                  lVar39 = lVar39 + local_458;
                  local_5f8 = local_5f8 + local_5a8;
                  local_5e0 = local_5e0 + local_5a8;
                  local_618 = local_618 + local_458;
                  local_5c8 = local_5c8 + local_458;
                  lVar37 = lVar37 + local_458;
                  lVar21 = lVar21 + local_5a8;
                  local_678 = local_678 + local_5a8;
                  lVar36 = lVar36 + local_458;
                  lVar31 = lVar31 + local_458;
                  lVar29 = lVar29 + local_458;
                  lVar28 = lVar28 + local_5a8;
                  lVar16 = lVar16 + local_5a8;
                  lVar32 = lVar32 + local_5a8;
                  lVar25 = lVar25 + local_5a8;
                  uVar17 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar17;
                } while (uVar8 != uVar17);
              }
              if ((int)uVar24 <= (int)uVar6) {
                lVar28 = (long)local_5a0.begin.z;
                lVar20 = (long)local_660.begin.z;
                local_5a8 = local_660.kstride * 8;
                lVar34 = (local_470 - lVar20) * local_5a8;
                lVar25 = (local_538 - local_660.begin.y) * local_660.jstride * 8;
                local_620 = lVar25 + lVar34;
                lVar32 = (local_530 - local_660.begin.y) * local_660.jstride * 8;
                local_458 = local_5a0.kstride * 4;
                lVar38 = (local_470 - lVar28) * local_458;
                lVar35 = (local_538 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar29 = (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar39 = lVar38 + lVar29;
                lVar26 = (local_480 - lVar20) * local_5a8;
                lVar36 = (local_480 - lVar28) * local_458;
                lVar37 = lVar36 + lVar29;
                lVar31 = (local_520 - lVar28) * local_458;
                lVar29 = lVar31 + lVar29;
                lVar16 = (local_520 - lVar20) * local_5a8;
                lVar20 = local_660.nstride * local_5d8;
                lVar28 = (long)local_660.begin.x;
                lVar21 = lVar34 + lVar32 + lVar20 + lVar28 * -8;
                local_678 = lVar26 + lVar32 + lVar20 + lVar28 * -8;
                lVar34 = local_620 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_5f8 = lVar26 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_600 = (long)local_660.p + lVar21;
                lVar21 = lVar21 + (long)local_660.p;
                local_5e0 = (long)local_660.p + local_678;
                local_678 = local_678 + (long)local_660.p;
                lVar32 = lVar32 + lVar16 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar16 = lVar16 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar26 = (long)local_5a0.begin.x * -4;
                local_618 = lVar38 + lVar35 + local_3d8;
                lVar20 = local_3e0 + lVar39;
                lVar39 = lVar39 + local_3d8;
                local_668 = lVar36 + lVar35 + local_3d8;
                local_5c8 = local_3e0 + lVar37;
                lVar37 = lVar37 + local_3d8;
                lVar36 = lVar35 + lVar31 + local_3d8;
                lVar31 = local_3e0 + lVar29;
                lVar29 = lVar29 + local_3d8;
                lVar25 = lVar16;
                uVar19 = local_410;
                lVar28 = lVar32;
                do {
                  if (*(int *)(lVar29 + lVar26) == 0) {
                    iVar27 = *(int *)(lVar31 + lVar26);
                    local_608 = lVar21;
                    local_5e8 = lVar32;
                    local_5b0 = lVar29;
                    if (((iVar27 == 1) || (*(int *)(lVar36 + lVar26) == 1)) ||
                       ((*(int *)(lVar39 + lVar26) == 1 || (*(int *)(lVar37 + lVar26) == 1)))) {
                      *(double *)(lVar28 + local_518 * 8) =
                           ((double)*(int *)(lVar37 + lVar26) *
                            *(double *)(local_678 + local_518 * 8) +
                           (double)*(int *)(lVar39 + lVar26) * *(double *)(lVar21 + local_518 * 8) +
                           (double)iVar27 * *(double *)(lVar28 + local_4f8 * 8) +
                           (double)*(int *)(lVar36 + lVar26) * *(double *)(lVar16 + local_518 * 8))
                           / (double)(*(int *)(lVar39 + lVar26) + *(int *)(lVar37 + lVar26) +
                                     *(int *)(lVar36 + lVar26) + iVar27);
                      local_620 = lVar34;
                      local_450 = lVar20;
                    }
                    else {
                      *(double *)(lVar32 + local_518 * 8) =
                           ((double)*(int *)(local_668 + lVar26) *
                            *(double *)(local_5f8 + local_518 * 8) +
                           (double)*(int *)(local_618 + lVar26) *
                           *(double *)(lVar34 + local_518 * 8) +
                           (double)*(int *)(local_5c8 + lVar26) *
                           *(double *)(local_5e0 + local_4f8 * 8) +
                           (double)*(int *)(lVar20 + lVar26) *
                           *(double *)(local_600 + local_4f8 * 8) +
                           *(double *)(lVar25 + local_4f8 * 8)) /
                           (double)(*(int *)(local_668 + lVar26) +
                                    *(int *)(lVar20 + lVar26) + *(int *)(local_5c8 + lVar26) +
                                    *(int *)(local_618 + lVar26) + 1);
                    }
                  }
                  lVar34 = lVar34 + local_5a8;
                  local_600 = local_600 + local_5a8;
                  local_618 = local_618 + local_458;
                  lVar20 = lVar20 + local_458;
                  lVar39 = lVar39 + local_458;
                  local_5f8 = local_5f8 + local_5a8;
                  local_5e0 = local_5e0 + local_5a8;
                  local_668 = local_668 + local_458;
                  local_5c8 = local_5c8 + local_458;
                  lVar37 = lVar37 + local_458;
                  lVar21 = lVar21 + local_5a8;
                  local_678 = local_678 + local_5a8;
                  lVar36 = lVar36 + local_458;
                  lVar31 = lVar31 + local_458;
                  lVar29 = lVar29 + local_458;
                  lVar28 = lVar28 + local_5a8;
                  lVar16 = lVar16 + local_5a8;
                  lVar32 = lVar32 + local_5a8;
                  lVar25 = lVar25 + local_5a8;
                  uVar17 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar17;
                } while (uVar8 != uVar17);
              }
              if ((int)uVar24 <= (int)uVar6) {
                lVar28 = (long)local_5a0.begin.z;
                lVar20 = (long)local_660.begin.z;
                local_5a8 = local_660.kstride * 8;
                lVar34 = (local_470 - lVar20) * local_5a8;
                lVar25 = (local_4c8 - local_660.begin.y) * local_660.jstride * 8;
                lVar32 = (local_468 - local_660.begin.y) * local_660.jstride * 8;
                local_458 = local_5a0.kstride * 4;
                lVar38 = (local_470 - lVar28) * local_458;
                lVar35 = (local_4c8 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar29 = (local_468 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar39 = lVar38 + lVar29;
                lVar26 = (local_480 - lVar20) * local_5a8;
                lVar36 = (local_480 - lVar28) * local_458;
                lVar37 = lVar36 + lVar29;
                lVar31 = (local_520 - lVar28) * local_458;
                lVar29 = lVar31 + lVar29;
                lVar16 = (local_520 - lVar20) * local_5a8;
                lVar20 = local_660.nstride * local_5d8;
                lVar28 = (long)local_660.begin.x;
                lVar21 = lVar34 + lVar32 + lVar20 + lVar28 * -8;
                local_678 = lVar26 + lVar32 + lVar20 + lVar28 * -8;
                lVar34 = lVar25 + lVar34 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_5f8 = lVar26 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                local_600 = (long)local_660.p + lVar21;
                lVar21 = lVar21 + (long)local_660.p;
                local_5e0 = (long)local_660.p + local_678;
                local_678 = local_678 + (long)local_660.p;
                lVar32 = lVar32 + lVar16 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar16 = lVar16 + lVar25 + lVar20 + lVar28 * -8 + (long)local_660.p;
                lVar26 = (long)local_5a0.begin.x * -4;
                local_668 = lVar38 + lVar35 + local_3d8;
                lVar20 = local_3e0 + lVar39;
                lVar39 = lVar39 + local_3d8;
                local_618 = lVar36 + lVar35 + local_3d8;
                local_5c8 = local_3e0 + lVar37;
                lVar37 = lVar37 + local_3d8;
                lVar36 = lVar35 + lVar31 + local_3d8;
                lVar31 = local_3e0 + lVar29;
                lVar29 = lVar29 + local_3d8;
                lVar25 = lVar16;
                uVar19 = local_410;
                lVar28 = lVar32;
                do {
                  if (*(int *)(lVar29 + lVar26) == 0) {
                    iVar27 = *(int *)(lVar31 + lVar26);
                    local_620 = lVar21;
                    local_608 = lVar32;
                    local_5e8 = lVar29;
                    if ((((iVar27 == 1) || (*(int *)(lVar36 + lVar26) == 1)) ||
                        (*(int *)(lVar39 + lVar26) == 1)) || (*(int *)(lVar37 + lVar26) == 1)) {
                      *(double *)(lVar28 + local_518 * 8) =
                           ((double)*(int *)(lVar37 + lVar26) *
                            *(double *)(local_678 + local_518 * 8) +
                           (double)*(int *)(lVar39 + lVar26) * *(double *)(lVar21 + local_518 * 8) +
                           (double)iVar27 * *(double *)(lVar28 + local_4f8 * 8) +
                           (double)*(int *)(lVar36 + lVar26) * *(double *)(lVar16 + local_518 * 8))
                           / (double)(*(int *)(lVar39 + lVar26) + *(int *)(lVar37 + lVar26) +
                                     *(int *)(lVar36 + lVar26) + iVar27);
                      local_5b0 = lVar34;
                      local_450 = lVar20;
                    }
                    else {
                      *(double *)(lVar32 + local_518 * 8) =
                           ((double)*(int *)(local_618 + lVar26) *
                            *(double *)(local_5f8 + local_518 * 8) +
                           (double)*(int *)(local_668 + lVar26) *
                           *(double *)(lVar34 + local_518 * 8) +
                           (double)*(int *)(local_5c8 + lVar26) *
                           *(double *)(local_5e0 + local_4f8 * 8) +
                           (double)*(int *)(lVar20 + lVar26) *
                           *(double *)(local_600 + local_4f8 * 8) +
                           *(double *)(lVar25 + local_4f8 * 8)) /
                           (double)(*(int *)(local_618 + lVar26) +
                                    *(int *)(lVar20 + lVar26) + *(int *)(local_5c8 + lVar26) +
                                    *(int *)(local_668 + lVar26) + 1);
                    }
                  }
                  lVar34 = lVar34 + local_5a8;
                  local_600 = local_600 + local_5a8;
                  local_668 = local_668 + local_458;
                  lVar20 = lVar20 + local_458;
                  lVar39 = lVar39 + local_458;
                  local_5f8 = local_5f8 + local_5a8;
                  local_5e0 = local_5e0 + local_5a8;
                  local_618 = local_618 + local_458;
                  local_5c8 = local_5c8 + local_458;
                  lVar37 = lVar37 + local_458;
                  lVar21 = lVar21 + local_5a8;
                  local_678 = local_678 + local_5a8;
                  lVar36 = lVar36 + local_458;
                  lVar31 = lVar31 + local_458;
                  lVar29 = lVar29 + local_458;
                  lVar28 = lVar28 + local_5a8;
                  lVar16 = lVar16 + local_5a8;
                  lVar32 = lVar32 + local_5a8;
                  lVar25 = lVar25 + local_5a8;
                  uVar17 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar17;
                } while (uVar8 != uVar17);
              }
              if ((int)uVar9 <= (int)uVar7) {
                lVar28 = (long)local_5a0.begin.y;
                lVar36 = (long)local_660.begin.y;
                local_5a8 = local_660.jstride * 8;
                lVar32 = (local_4d0 - lVar36) * local_5a8;
                lVar34 = (local_520 - local_660.begin.z) * local_660.kstride * 8;
                lVar37 = (local_508 - local_660.begin.z) * local_660.kstride * 8;
                local_5c8 = local_5a0.jstride * 4;
                lVar35 = (local_4d0 - lVar28) * local_5c8;
                lVar29 = (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar20 = lVar35 + lVar29;
                lVar16 = (local_520 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar26 = (local_4d8 - lVar36) * local_5a8;
                lVar39 = (local_4d8 - lVar28) * local_5c8;
                lVar25 = lVar39 + lVar29;
                lVar38 = (local_538 - lVar28) * local_5c8;
                lVar29 = lVar29 + lVar38;
                lVar31 = (local_538 - lVar36) * local_5a8;
                lVar28 = local_660.nstride * local_5d8;
                lVar36 = (long)local_660.begin.x;
                lVar21 = lVar32 + lVar37 + lVar28 + lVar36 * -8;
                local_678 = lVar26 + lVar37 + lVar28 + lVar36 * -8;
                lVar32 = lVar32 + lVar34 + lVar28 + lVar36 * -8 + (long)local_660.p;
                local_668 = lVar26 + lVar34 + lVar28 + lVar36 * -8 + (long)local_660.p;
                local_618 = (long)local_660.p + lVar21;
                lVar21 = lVar21 + (long)local_660.p;
                local_5f8 = (long)local_660.p + local_678;
                local_678 = local_678 + (long)local_660.p;
                lVar26 = lVar37 + lVar31 + lVar28 + lVar36 * -8 + (long)local_660.p;
                lVar31 = lVar31 + lVar34 + lVar28 + lVar36 * -8 + (long)local_660.p;
                lVar37 = (long)local_5a0.begin.x * -4;
                lVar35 = lVar35 + lVar16 + local_3c8;
                local_600 = local_478 + lVar20;
                lVar20 = lVar20 + local_3c8;
                local_670 = lVar39 + lVar16 + local_3c8;
                local_5e0 = local_478 + lVar25;
                lVar25 = lVar25 + local_3c8;
                lVar16 = lVar38 + lVar16 + local_3c8;
                lVar28 = local_478 + lVar29;
                lVar29 = lVar29 + local_3c8;
                uVar19 = local_4b0;
                lVar34 = lVar31;
                lVar36 = lVar26;
                do {
                  if (*(int *)(lVar29 + lVar37) == 0) {
                    iVar27 = *(int *)(lVar28 + lVar37);
                    local_620 = lVar21;
                    local_608 = lVar32;
                    local_5e8 = lVar36;
                    local_5b0 = lVar35;
                    if (((iVar27 == 1) || (*(int *)(lVar20 + lVar37) == 1)) ||
                       ((*(int *)(lVar25 + lVar37) == 1 || (*(int *)(lVar16 + lVar37) == 1)))) {
                      *(double *)(lVar26 + local_510 * 8) =
                           ((double)*(int *)(lVar16 + lVar37) * *(double *)(lVar31 + local_510 * 8)
                           + (double)*(int *)(lVar25 + lVar37) *
                             *(double *)(local_678 + local_510 * 8) +
                             (double)iVar27 * *(double *)(lVar26 + local_500 * 8) +
                             (double)*(int *)(lVar20 + lVar37) * *(double *)(lVar21 + local_510 * 8)
                           ) / (double)(*(int *)(lVar25 + lVar37) + *(int *)(lVar16 + lVar37) +
                                       *(int *)(lVar20 + lVar37) + iVar27);
                    }
                    else {
                      *(double *)(lVar36 + local_510 * 8) =
                           ((double)*(int *)(local_670 + lVar37) *
                            *(double *)(local_668 + local_510 * 8) +
                           (double)*(int *)(lVar35 + lVar37) * *(double *)(lVar32 + local_510 * 8) +
                           (double)*(int *)(local_600 + lVar37) *
                           *(double *)(local_618 + local_500 * 8) +
                           (double)*(int *)(local_5e0 + lVar37) *
                           *(double *)(local_5f8 + local_500 * 8) +
                           *(double *)(lVar34 + local_500 * 8)) /
                           (double)(*(int *)(local_670 + lVar37) +
                                    *(int *)(local_600 + lVar37) + *(int *)(local_5e0 + lVar37) +
                                    *(int *)(lVar35 + lVar37) + 1);
                    }
                  }
                  lVar32 = lVar32 + local_5a8;
                  local_618 = local_618 + local_5a8;
                  local_600 = local_600 + local_5c8;
                  lVar35 = lVar35 + local_5c8;
                  lVar20 = lVar20 + local_5c8;
                  local_668 = local_668 + local_5a8;
                  local_5f8 = local_5f8 + local_5a8;
                  local_5e0 = local_5e0 + local_5c8;
                  local_670 = local_670 + local_5c8;
                  lVar25 = lVar25 + local_5c8;
                  lVar21 = lVar21 + local_5a8;
                  local_678 = local_678 + local_5a8;
                  lVar28 = lVar28 + local_5c8;
                  lVar16 = lVar16 + local_5c8;
                  lVar29 = lVar29 + local_5c8;
                  lVar26 = lVar26 + local_5a8;
                  lVar31 = lVar31 + local_5a8;
                  lVar36 = lVar36 + local_5a8;
                  lVar34 = lVar34 + local_5a8;
                  uVar17 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar17;
                } while (uVar8 != uVar17);
              }
              if ((int)uVar9 <= (int)uVar7) {
                lVar34 = (long)local_5a0.begin.y;
                lVar36 = (long)local_660.begin.y;
                local_5c8 = local_660.jstride * 8;
                lVar32 = (local_4d0 - lVar36) * local_5c8;
                lVar28 = (local_4e0 - local_660.begin.z) * local_660.kstride * 8;
                lVar37 = (local_460 - local_660.begin.z) * local_660.kstride * 8;
                local_5e0 = local_5a0.jstride * 4;
                lVar35 = (local_4d0 - lVar34) * local_5e0;
                lVar31 = (local_460 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar20 = lVar35 + lVar31;
                lVar29 = (local_4e0 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar21 = (local_4d8 - lVar36) * local_5c8;
                lVar39 = (local_4d8 - lVar34) * local_5e0;
                lVar25 = lVar39 + lVar31;
                lVar38 = (local_538 - lVar34) * local_5e0;
                lVar31 = lVar31 + lVar38;
                lVar26 = (local_538 - lVar36) * local_5c8;
                lVar34 = local_660.nstride * local_5d8;
                lVar36 = (long)local_660.begin.x;
                lVar16 = lVar32 + lVar37 + lVar34 + lVar36 * -8;
                local_680 = lVar21 + lVar37 + lVar34 + lVar36 * -8;
                lVar32 = lVar32 + lVar28 + lVar34 + lVar36 * -8 + (long)local_660.p;
                local_670 = lVar21 + lVar28 + lVar34 + lVar36 * -8 + (long)local_660.p;
                local_668 = (long)local_660.p + lVar16;
                lVar16 = lVar16 + (long)local_660.p;
                local_618 = (long)local_660.p + local_680;
                local_680 = local_680 + (long)local_660.p;
                lVar21 = lVar37 + lVar26 + lVar34 + lVar36 * -8 + (long)local_660.p;
                lVar26 = lVar26 + lVar28 + lVar34 + lVar36 * -8 + (long)local_660.p;
                local_5a8 = (long)local_5a0.begin.x * -4;
                lVar35 = lVar35 + lVar29 + local_3c8;
                local_5f8 = local_478 + lVar20;
                lVar20 = lVar20 + local_3c8;
                local_678 = lVar39 + lVar29 + local_3c8;
                local_600 = local_478 + lVar25;
                lVar25 = lVar25 + local_3c8;
                lVar37 = lVar38 + lVar29 + local_3c8;
                lVar28 = local_478 + lVar31;
                lVar31 = lVar31 + local_3c8;
                uVar19 = local_4b0;
                lVar34 = lVar26;
                lVar36 = lVar21;
                do {
                  if (*(int *)(lVar31 + local_5a8) == 0) {
                    iVar27 = *(int *)(lVar28 + local_5a8);
                    local_620 = lVar16;
                    local_608 = lVar32;
                    local_5e8 = lVar36;
                    local_5b0 = lVar35;
                    if (((iVar27 == 1) || (*(int *)(lVar20 + local_5a8) == 1)) ||
                       ((*(int *)(lVar25 + local_5a8) == 1 || (*(int *)(lVar37 + local_5a8) == 1))))
                    {
                      *(double *)(lVar21 + local_510 * 8) =
                           ((double)*(int *)(lVar37 + local_5a8) *
                            *(double *)(lVar26 + local_510 * 8) +
                           (double)*(int *)(lVar25 + local_5a8) *
                           *(double *)(local_680 + local_510 * 8) +
                           (double)iVar27 * *(double *)(lVar21 + local_500 * 8) +
                           (double)*(int *)(lVar20 + local_5a8) *
                           *(double *)(lVar16 + local_510 * 8)) /
                           (double)(*(int *)(lVar25 + local_5a8) + *(int *)(lVar37 + local_5a8) +
                                   *(int *)(lVar20 + local_5a8) + iVar27);
                    }
                    else {
                      *(double *)(lVar36 + local_510 * 8) =
                           ((double)*(int *)(local_678 + local_5a8) *
                            *(double *)(local_670 + local_510 * 8) +
                           (double)*(int *)(lVar35 + local_5a8) *
                           *(double *)(lVar32 + local_510 * 8) +
                           (double)*(int *)(local_5f8 + local_5a8) *
                           *(double *)(local_668 + local_500 * 8) +
                           (double)*(int *)(local_600 + local_5a8) *
                           *(double *)(local_618 + local_500 * 8) +
                           *(double *)(lVar34 + local_500 * 8)) /
                           (double)(*(int *)(local_678 + local_5a8) +
                                    *(int *)(local_5f8 + local_5a8) +
                                    *(int *)(local_600 + local_5a8) + *(int *)(lVar35 + local_5a8) +
                                   1);
                    }
                  }
                  lVar32 = lVar32 + local_5c8;
                  local_668 = local_668 + local_5c8;
                  local_5f8 = local_5f8 + local_5e0;
                  lVar35 = lVar35 + local_5e0;
                  lVar20 = lVar20 + local_5e0;
                  local_670 = local_670 + local_5c8;
                  local_618 = local_618 + local_5c8;
                  local_600 = local_600 + local_5e0;
                  local_678 = local_678 + local_5e0;
                  lVar25 = lVar25 + local_5e0;
                  lVar16 = lVar16 + local_5c8;
                  local_680 = local_680 + local_5c8;
                  lVar28 = lVar28 + local_5e0;
                  lVar37 = lVar37 + local_5e0;
                  lVar31 = lVar31 + local_5e0;
                  lVar21 = lVar21 + local_5c8;
                  lVar26 = lVar26 + local_5c8;
                  lVar36 = lVar36 + local_5c8;
                  lVar34 = lVar34 + local_5c8;
                  uVar17 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar17;
                } while (uVar8 != uVar17);
              }
              if ((int)uVar9 <= (int)uVar7) {
                lVar28 = (long)local_5a0.begin.y;
                lVar36 = (long)local_660.begin.y;
                local_5a8 = local_660.jstride * 8;
                lVar32 = (local_4d0 - lVar36) * local_5a8;
                lVar34 = (local_520 - local_660.begin.z) * local_660.kstride * 8;
                lVar37 = (local_508 - local_660.begin.z) * local_660.kstride * 8;
                local_5c8 = local_5a0.jstride * 4;
                lVar35 = (local_4d0 - lVar28) * local_5c8;
                lVar29 = (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar20 = lVar35 + lVar29;
                lVar16 = (local_520 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar26 = (local_4d8 - lVar36) * local_5a8;
                lVar39 = (local_4d8 - lVar28) * local_5c8;
                lVar25 = lVar39 + lVar29;
                lVar38 = (local_538 - lVar28) * local_5c8;
                lVar29 = lVar29 + lVar38;
                lVar31 = (local_538 - lVar36) * local_5a8;
                lVar28 = local_660.nstride * local_5d8;
                lVar36 = (long)local_660.begin.x;
                lVar21 = lVar32 + lVar37 + lVar28 + lVar36 * -8;
                local_678 = lVar26 + lVar37 + lVar28 + lVar36 * -8;
                lVar32 = lVar32 + lVar34 + lVar28 + lVar36 * -8 + (long)local_660.p;
                local_668 = lVar26 + lVar34 + lVar28 + lVar36 * -8 + (long)local_660.p;
                local_618 = (long)local_660.p + lVar21;
                lVar21 = lVar21 + (long)local_660.p;
                local_5f8 = (long)local_660.p + local_678;
                local_678 = local_678 + (long)local_660.p;
                lVar26 = lVar37 + lVar31 + lVar28 + lVar36 * -8 + (long)local_660.p;
                lVar31 = lVar31 + lVar34 + lVar28 + lVar36 * -8 + (long)local_660.p;
                lVar37 = (long)local_5a0.begin.x * -4;
                lVar35 = lVar35 + lVar16 + local_3d8;
                local_600 = local_3e0 + lVar20;
                lVar20 = lVar20 + local_3d8;
                local_670 = lVar39 + lVar16 + local_3d8;
                local_5e0 = local_3e0 + lVar25;
                lVar25 = lVar25 + local_3d8;
                lVar16 = lVar38 + lVar16 + local_3d8;
                lVar28 = local_3e0 + lVar29;
                lVar29 = lVar29 + local_3d8;
                uVar19 = local_4b0;
                lVar34 = lVar31;
                lVar36 = lVar26;
                do {
                  if (*(int *)(lVar29 + lVar37) == 0) {
                    iVar27 = *(int *)(lVar28 + lVar37);
                    local_620 = lVar21;
                    local_608 = lVar32;
                    local_5e8 = lVar36;
                    local_5b0 = lVar35;
                    if ((((iVar27 == 1) || (*(int *)(lVar20 + lVar37) == 1)) ||
                        (*(int *)(lVar25 + lVar37) == 1)) || (*(int *)(lVar16 + lVar37) == 1)) {
                      *(double *)(lVar26 + local_518 * 8) =
                           ((double)*(int *)(lVar16 + lVar37) * *(double *)(lVar31 + local_518 * 8)
                           + (double)*(int *)(lVar25 + lVar37) *
                             *(double *)(local_678 + local_518 * 8) +
                             (double)iVar27 * *(double *)(lVar26 + local_4f8 * 8) +
                             (double)*(int *)(lVar20 + lVar37) * *(double *)(lVar21 + local_518 * 8)
                           ) / (double)(*(int *)(lVar25 + lVar37) + *(int *)(lVar16 + lVar37) +
                                       *(int *)(lVar20 + lVar37) + iVar27);
                    }
                    else {
                      *(double *)(lVar36 + local_518 * 8) =
                           ((double)*(int *)(local_670 + lVar37) *
                            *(double *)(local_668 + local_518 * 8) +
                           (double)*(int *)(lVar35 + lVar37) * *(double *)(lVar32 + local_518 * 8) +
                           (double)*(int *)(local_600 + lVar37) *
                           *(double *)(local_618 + local_4f8 * 8) +
                           (double)*(int *)(local_5e0 + lVar37) *
                           *(double *)(local_5f8 + local_4f8 * 8) +
                           *(double *)(lVar34 + local_4f8 * 8)) /
                           (double)(*(int *)(local_670 + lVar37) +
                                    *(int *)(local_600 + lVar37) + *(int *)(local_5e0 + lVar37) +
                                    *(int *)(lVar35 + lVar37) + 1);
                    }
                  }
                  lVar32 = lVar32 + local_5a8;
                  local_618 = local_618 + local_5a8;
                  local_600 = local_600 + local_5c8;
                  lVar35 = lVar35 + local_5c8;
                  lVar20 = lVar20 + local_5c8;
                  local_668 = local_668 + local_5a8;
                  local_5f8 = local_5f8 + local_5a8;
                  local_5e0 = local_5e0 + local_5c8;
                  local_670 = local_670 + local_5c8;
                  lVar25 = lVar25 + local_5c8;
                  lVar21 = lVar21 + local_5a8;
                  local_678 = local_678 + local_5a8;
                  lVar28 = lVar28 + local_5c8;
                  lVar16 = lVar16 + local_5c8;
                  lVar29 = lVar29 + local_5c8;
                  lVar26 = lVar26 + local_5a8;
                  lVar31 = lVar31 + local_5a8;
                  lVar36 = lVar36 + local_5a8;
                  lVar34 = lVar34 + local_5a8;
                  uVar17 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar17;
                } while (uVar8 != uVar17);
              }
              if ((int)uVar9 <= (int)uVar7) {
                lVar34 = (long)local_5a0.begin.y;
                lVar36 = (long)local_660.begin.y;
                local_5c8 = local_660.jstride * 8;
                lVar32 = (local_4d0 - lVar36) * local_5c8;
                lVar28 = (local_4e0 - local_660.begin.z) * local_660.kstride * 8;
                lVar37 = (local_460 - local_660.begin.z) * local_660.kstride * 8;
                local_5e0 = local_5a0.jstride * 4;
                lVar35 = (local_4d0 - lVar34) * local_5e0;
                lVar31 = (local_460 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar20 = lVar35 + lVar31;
                lVar29 = (local_4e0 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar21 = (local_4d8 - lVar36) * local_5c8;
                lVar39 = (local_4d8 - lVar34) * local_5e0;
                lVar25 = lVar39 + lVar31;
                lVar38 = (local_538 - lVar34) * local_5e0;
                lVar31 = lVar31 + lVar38;
                lVar26 = (local_538 - lVar36) * local_5c8;
                lVar34 = local_660.nstride * local_5d8;
                lVar36 = (long)local_660.begin.x;
                lVar16 = lVar32 + lVar37 + lVar34 + lVar36 * -8;
                local_680 = lVar21 + lVar37 + lVar34 + lVar36 * -8;
                lVar32 = lVar32 + lVar28 + lVar34 + lVar36 * -8 + (long)local_660.p;
                local_670 = lVar21 + lVar28 + lVar34 + lVar36 * -8 + (long)local_660.p;
                local_668 = (long)local_660.p + lVar16;
                lVar16 = lVar16 + (long)local_660.p;
                local_618 = (long)local_660.p + local_680;
                local_680 = local_680 + (long)local_660.p;
                lVar21 = lVar37 + lVar26 + lVar34 + lVar36 * -8 + (long)local_660.p;
                lVar26 = lVar26 + lVar28 + lVar34 + lVar36 * -8 + (long)local_660.p;
                local_5a8 = (long)local_5a0.begin.x * -4;
                lVar35 = lVar35 + lVar29 + local_3d8;
                local_5f8 = local_3e0 + lVar20;
                lVar20 = lVar20 + local_3d8;
                local_678 = lVar39 + lVar29 + local_3d8;
                local_600 = local_3e0 + lVar25;
                lVar25 = lVar25 + local_3d8;
                lVar37 = lVar38 + lVar29 + local_3d8;
                lVar28 = local_3e0 + lVar31;
                lVar31 = lVar31 + local_3d8;
                uVar19 = local_4b0;
                lVar34 = lVar26;
                lVar36 = lVar21;
                do {
                  if (*(int *)(lVar31 + local_5a8) == 0) {
                    iVar27 = *(int *)(lVar28 + local_5a8);
                    local_620 = lVar16;
                    local_608 = lVar32;
                    local_5e8 = lVar36;
                    local_5b0 = lVar35;
                    if (((iVar27 == 1) || (*(int *)(lVar20 + local_5a8) == 1)) ||
                       ((*(int *)(lVar25 + local_5a8) == 1 || (*(int *)(lVar37 + local_5a8) == 1))))
                    {
                      *(double *)(lVar21 + local_518 * 8) =
                           ((double)*(int *)(lVar37 + local_5a8) *
                            *(double *)(lVar26 + local_518 * 8) +
                           (double)*(int *)(lVar25 + local_5a8) *
                           *(double *)(local_680 + local_518 * 8) +
                           (double)iVar27 * *(double *)(lVar21 + local_4f8 * 8) +
                           (double)*(int *)(lVar20 + local_5a8) *
                           *(double *)(lVar16 + local_518 * 8)) /
                           (double)(*(int *)(lVar25 + local_5a8) + *(int *)(lVar37 + local_5a8) +
                                   *(int *)(lVar20 + local_5a8) + iVar27);
                    }
                    else {
                      *(double *)(lVar36 + local_518 * 8) =
                           ((double)*(int *)(local_678 + local_5a8) *
                            *(double *)(local_670 + local_518 * 8) +
                           (double)*(int *)(lVar35 + local_5a8) *
                           *(double *)(lVar32 + local_518 * 8) +
                           (double)*(int *)(local_5f8 + local_5a8) *
                           *(double *)(local_668 + local_4f8 * 8) +
                           (double)*(int *)(local_600 + local_5a8) *
                           *(double *)(local_618 + local_4f8 * 8) +
                           *(double *)(lVar34 + local_4f8 * 8)) /
                           (double)(*(int *)(local_678 + local_5a8) +
                                    *(int *)(local_5f8 + local_5a8) +
                                    *(int *)(local_600 + local_5a8) + *(int *)(lVar35 + local_5a8) +
                                   1);
                    }
                  }
                  lVar32 = lVar32 + local_5c8;
                  local_668 = local_668 + local_5c8;
                  local_5f8 = local_5f8 + local_5e0;
                  lVar35 = lVar35 + local_5e0;
                  lVar20 = lVar20 + local_5e0;
                  local_670 = local_670 + local_5c8;
                  local_618 = local_618 + local_5c8;
                  local_600 = local_600 + local_5e0;
                  local_678 = local_678 + local_5e0;
                  lVar25 = lVar25 + local_5e0;
                  lVar16 = lVar16 + local_5c8;
                  local_680 = local_680 + local_5c8;
                  lVar28 = lVar28 + local_5e0;
                  lVar37 = lVar37 + local_5e0;
                  lVar31 = lVar31 + local_5e0;
                  lVar21 = lVar21 + local_5c8;
                  lVar26 = lVar26 + local_5c8;
                  lVar36 = lVar36 + local_5c8;
                  lVar34 = lVar34 + local_5c8;
                  uVar17 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar17;
                } while (uVar8 != uVar17);
              }
              if ((int)uVar33 <= (int)uVar30) {
                lVar20 = local_508 - local_660.begin.z;
                lVar32 = local_538 - local_660.begin.y;
                lVar25 = local_530 - local_660.begin.y;
                lVar37 = local_520 - local_660.begin.z;
                lVar26 = (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar36 = (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar35 = (long)local_5a0.begin.x;
                lVar21 = lVar36 + lVar26 + lVar35 * -4;
                lVar34 = lVar20 * local_660.kstride * 8;
                lVar31 = local_660.kstride * 8 * lVar37;
                lVar38 = (long)local_660.begin.x;
                lVar16 = lVar25 * local_660.jstride * 8;
                lVar28 = local_660.jstride * 8 * lVar32;
                lVar29 = local_660.nstride * local_5d8;
                lVar32 = lVar29 + (local_660.jstride * lVar32 +
                                  local_660.kstride * lVar20 + local_500) * 8 + lVar38 * -8;
                lVar37 = lVar29 + (local_660.kstride * lVar37 +
                                  local_660.jstride * lVar25 + local_500) * 8 + lVar38 * -8;
                lVar25 = lVar16 + lVar34 + lVar29 + lVar38 * -8 + local_4a8;
                lVar36 = (local_520 - local_5a0.begin.z) * local_5a0.kstride * 4 + lVar36 +
                         lVar35 * -4 + local_478;
                lVar20 = local_478 + lVar21;
                lVar26 = (local_538 - local_5a0.begin.y) * local_5a0.jstride * 4 + lVar26 +
                         lVar35 * -4 + local_478;
                lVar35 = 0;
                do {
                  if (*(int *)(lVar20 + lVar35 * 4) == 0) {
                    iVar27 = *(int *)(lVar20 + -4 + lVar35 * 4);
                    if (((iVar27 == 1) || (*(int *)(lVar20 + 4 + lVar35 * 4) == 1)) ||
                       ((*(int *)(lVar26 + lVar35 * 4) == 1 || (*(int *)(lVar36 + lVar35 * 4) == 1))
                       )) {
                      iVar11 = *(int *)(lVar21 + local_3e8 + lVar35 * 4);
                      iVar15 = *(int *)(lVar26 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 *
                            *(double *)
                             ((long)local_660.p +
                             lVar35 * 8 + lVar16 + lVar31 + lVar29 + lVar38 * -8 + local_4a8) +
                           (double)iVar15 *
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar34 + lVar28 + lVar29 + lVar38 * -8 + local_4a8) +
                           (double)iVar27 *
                           *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + -8) +
                           (double)iVar11 * *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + 8)
                           ) / (double)(iVar15 + iVar1 + iVar11 + iVar27);
                    }
                    else {
                      iVar27 = *(int *)(lVar26 + -4 + lVar35 * 4);
                      iVar11 = *(int *)(lVar26 + 4 + lVar35 * 4);
                      iVar15 = *(int *)(lVar36 + -4 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + 4 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 * *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + 8)
                            + (double)iVar15 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + -8) +
                              (double)iVar27 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + -8) +
                              (double)iVar11 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + 8) +
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar28 + lVar31 + lVar29 + lVar38 * -8 + local_4a8)) /
                           (double)(iVar27 + iVar11 + iVar15 + iVar1 + 1);
                    }
                  }
                  lVar35 = lVar35 + 1;
                } while (uVar14 != (uint)lVar35);
              }
              if ((int)uVar33 <= (int)uVar30) {
                lVar20 = local_460 - local_660.begin.z;
                lVar37 = local_538 - local_660.begin.y;
                lVar25 = local_530 - local_660.begin.y;
                lVar39 = local_4e0 - local_660.begin.z;
                lVar26 = (local_460 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar36 = (local_530 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar35 = (long)local_5a0.begin.x;
                lVar21 = lVar36 + lVar26 + lVar35 * -4;
                lVar34 = lVar20 * local_660.kstride * 8;
                lVar31 = local_660.kstride * 8 * lVar39;
                lVar38 = (long)local_660.begin.x;
                lVar16 = lVar25 * local_660.jstride * 8;
                lVar28 = local_660.jstride * 8 * lVar37;
                lVar29 = local_660.nstride * local_5d8;
                lVar32 = lVar29 + (local_660.jstride * lVar37 +
                                  local_660.kstride * lVar20 + local_500) * 8 + lVar38 * -8;
                lVar37 = lVar29 + (local_660.kstride * lVar39 +
                                  local_660.jstride * lVar25 + local_500) * 8 + lVar38 * -8;
                lVar25 = lVar16 + lVar34 + lVar29 + lVar38 * -8 + local_4a8;
                lVar36 = (local_4e0 - local_5a0.begin.z) * local_5a0.kstride * 4 + lVar36 +
                         lVar35 * -4 + local_478;
                lVar20 = local_478 + lVar21;
                lVar26 = (local_538 - local_5a0.begin.y) * local_5a0.jstride * 4 + lVar26 +
                         lVar35 * -4 + local_478;
                lVar35 = 0;
                do {
                  if (*(int *)(lVar20 + lVar35 * 4) == 0) {
                    iVar27 = *(int *)(lVar20 + -4 + lVar35 * 4);
                    if ((((iVar27 == 1) || (*(int *)(lVar20 + 4 + lVar35 * 4) == 1)) ||
                        (*(int *)(lVar26 + lVar35 * 4) == 1)) ||
                       (*(int *)(lVar36 + lVar35 * 4) == 1)) {
                      iVar11 = *(int *)(lVar21 + local_3e8 + lVar35 * 4);
                      iVar15 = *(int *)(lVar26 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 *
                            *(double *)
                             ((long)local_660.p +
                             lVar35 * 8 + lVar16 + lVar31 + lVar29 + lVar38 * -8 + local_4a8) +
                           (double)iVar15 *
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar34 + lVar28 + lVar29 + lVar38 * -8 + local_4a8) +
                           (double)iVar27 *
                           *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + -8) +
                           (double)iVar11 * *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + 8)
                           ) / (double)(iVar15 + iVar1 + iVar11 + iVar27);
                    }
                    else {
                      iVar27 = *(int *)(lVar26 + -4 + lVar35 * 4);
                      iVar11 = *(int *)(lVar26 + 4 + lVar35 * 4);
                      iVar15 = *(int *)(lVar36 + -4 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + 4 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 * *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + 8)
                            + (double)iVar15 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + -8) +
                              (double)iVar27 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + -8) +
                              (double)iVar11 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + 8) +
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar28 + lVar31 + lVar29 + lVar38 * -8 + local_4a8)) /
                           (double)(iVar27 + iVar11 + iVar15 + iVar1 + 1);
                    }
                  }
                  lVar35 = lVar35 + 1;
                } while (uVar14 != (uint)lVar35);
              }
              if ((int)uVar33 <= (int)uVar30) {
                lVar20 = local_508 - local_660.begin.z;
                lVar25 = local_4c8 - local_660.begin.y;
                lVar36 = local_468 - local_660.begin.y;
                lVar37 = local_520 - local_660.begin.z;
                lVar35 = (local_508 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar21 = (local_468 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar38 = (long)local_5a0.begin.x;
                lVar26 = lVar21 + lVar35 + lVar38 * -4;
                lVar34 = lVar20 * local_660.kstride * 8;
                lVar31 = local_660.kstride * 8 * lVar37;
                lVar39 = (long)local_660.begin.x;
                lVar16 = lVar36 * local_660.jstride * 8;
                lVar28 = local_660.jstride * 8 * lVar25;
                lVar29 = local_660.nstride * local_5d8;
                lVar32 = lVar29 + (local_660.jstride * lVar25 +
                                  local_660.kstride * lVar20 + local_500) * 8 + lVar39 * -8;
                lVar37 = lVar29 + (local_660.kstride * lVar37 +
                                  local_660.jstride * lVar36 + local_500) * 8 + lVar39 * -8;
                lVar25 = lVar34 + lVar16 + lVar29 + lVar39 * -8 + local_4a8;
                lVar36 = (local_520 - local_5a0.begin.z) * local_5a0.kstride * 4 + lVar21 +
                         lVar38 * -4 + local_478;
                lVar20 = local_478 + lVar26;
                lVar21 = (local_4c8 - local_5a0.begin.y) * local_5a0.jstride * 4 + lVar35 +
                         lVar38 * -4 + local_478;
                lVar35 = 0;
                do {
                  if (*(int *)(lVar20 + lVar35 * 4) == 0) {
                    iVar27 = *(int *)(lVar20 + -4 + lVar35 * 4);
                    if (((iVar27 == 1) || (*(int *)(lVar20 + 4 + lVar35 * 4) == 1)) ||
                       ((*(int *)(lVar21 + lVar35 * 4) == 1 || (*(int *)(lVar36 + lVar35 * 4) == 1))
                       )) {
                      iVar11 = *(int *)(lVar26 + local_3e8 + lVar35 * 4);
                      iVar15 = *(int *)(lVar21 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 *
                            *(double *)
                             ((long)local_660.p +
                             lVar35 * 8 + lVar16 + lVar31 + lVar29 + lVar39 * -8 + local_4a8) +
                           (double)iVar15 *
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar34 + lVar28 + lVar29 + lVar39 * -8 + local_4a8) +
                           (double)iVar27 *
                           *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + -8) +
                           (double)iVar11 * *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + 8)
                           ) / (double)(iVar15 + iVar1 + iVar11 + iVar27);
                    }
                    else {
                      iVar27 = *(int *)(lVar21 + -4 + lVar35 * 4);
                      iVar11 = *(int *)(lVar21 + 4 + lVar35 * 4);
                      iVar15 = *(int *)(lVar36 + -4 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + 4 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 * *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + 8)
                            + (double)iVar15 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + -8) +
                              (double)iVar27 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + -8) +
                              (double)iVar11 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + 8) +
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar28 + lVar31 + lVar29 + lVar39 * -8 + local_4a8)) /
                           (double)(iVar27 + iVar11 + iVar15 + iVar1 + 1);
                    }
                  }
                  lVar35 = lVar35 + 1;
                } while (uVar14 != (uint)lVar35);
              }
              if ((int)uVar33 <= (int)uVar30) {
                lVar20 = local_460 - local_660.begin.z;
                lVar25 = local_4c8 - local_660.begin.y;
                lVar36 = local_468 - local_660.begin.y;
                lVar37 = local_4e0 - local_660.begin.z;
                lVar35 = (local_460 - local_5a0.begin.z) * local_5a0.kstride * 4;
                lVar21 = (local_468 - local_5a0.begin.y) * local_5a0.jstride * 4;
                lVar38 = (long)local_5a0.begin.x;
                lVar26 = lVar21 + lVar35 + lVar38 * -4;
                lVar34 = lVar20 * local_660.kstride * 8;
                lVar31 = local_660.kstride * 8 * lVar37;
                lVar39 = (long)local_660.begin.x;
                lVar16 = lVar36 * local_660.jstride * 8;
                lVar28 = local_660.jstride * 8 * lVar25;
                lVar29 = local_660.nstride * local_5d8;
                lVar32 = lVar29 + (local_660.jstride * lVar25 +
                                  local_660.kstride * lVar20 + local_500) * 8 + lVar39 * -8;
                lVar37 = lVar29 + (local_660.kstride * lVar37 +
                                  local_660.jstride * lVar36 + local_500) * 8 + lVar39 * -8;
                lVar25 = lVar16 + lVar34 + lVar29 + lVar39 * -8 + local_4a8;
                lVar36 = (local_4e0 - local_5a0.begin.z) * local_5a0.kstride * 4 + lVar21 +
                         lVar38 * -4 + local_478;
                lVar20 = local_478 + lVar26;
                lVar21 = (local_4c8 - local_5a0.begin.y) * local_5a0.jstride * 4 + lVar35 +
                         lVar38 * -4 + local_478;
                lVar35 = 0;
                do {
                  if (*(int *)(lVar20 + lVar35 * 4) == 0) {
                    iVar27 = *(int *)(lVar20 + -4 + lVar35 * 4);
                    if (((iVar27 == 1) || (*(int *)(lVar20 + 4 + lVar35 * 4) == 1)) ||
                       ((*(int *)(lVar21 + lVar35 * 4) == 1 || (*(int *)(lVar36 + lVar35 * 4) == 1))
                       )) {
                      iVar11 = *(int *)(lVar26 + local_3e8 + lVar35 * 4);
                      iVar15 = *(int *)(lVar21 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 *
                            *(double *)
                             ((long)local_660.p +
                             lVar35 * 8 + lVar16 + lVar31 + lVar29 + lVar39 * -8 + local_4a8) +
                           (double)iVar15 *
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar34 + lVar28 + lVar29 + lVar39 * -8 + local_4a8) +
                           (double)iVar27 *
                           *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + -8) +
                           (double)iVar11 * *(double *)((long)local_660.p + lVar35 * 8 + lVar25 + 8)
                           ) / (double)(iVar15 + iVar1 + iVar11 + iVar27);
                    }
                    else {
                      iVar27 = *(int *)(lVar21 + -4 + lVar35 * 4);
                      iVar11 = *(int *)(lVar21 + 4 + lVar35 * 4);
                      iVar15 = *(int *)(lVar36 + -4 + lVar35 * 4);
                      iVar1 = *(int *)(lVar36 + 4 + lVar35 * 4);
                      *(double *)((long)local_660.p + lVar35 * 8 + lVar25) =
                           ((double)iVar1 * *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + 8)
                            + (double)iVar15 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar37 + -8) +
                              (double)iVar27 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + -8) +
                              (double)iVar11 *
                              *(double *)((long)local_660.p + lVar35 * 8 + lVar32 + 8) +
                           *(double *)
                            ((long)local_660.p +
                            lVar35 * 8 + lVar28 + lVar31 + lVar29 + lVar39 * -8 + local_4a8)) /
                           (double)(iVar27 + iVar11 + iVar15 + iVar1 + 1);
                    }
                  }
                  lVar35 = lVar35 + 1;
                } while (uVar14 != (uint)lVar35);
              }
              if ((int)uVar24 <= (int)uVar6) {
                lVar20 = (long)local_5a0.begin.x;
                lVar34 = (long)local_5a0.begin.y;
                lVar28 = (long)local_5a0.begin.z;
                lVar36 = local_5a0.jstride * 4;
                local_5e8 = local_5a0.kstride * 4;
                lVar25 = (local_520 - lVar28) * local_5e8;
                local_5f8 = (local_4d0 - lVar34) * lVar36 + lVar25 + lVar20 * -4 + (long)local_5a0.p
                ;
                local_5e0 = (local_4d8 - lVar34) * lVar36 + lVar25 + lVar20 * -4 + (long)local_5a0.p
                ;
                lVar34 = (local_538 - lVar34) * lVar36;
                local_600 = lVar25 + lVar34 + lVar20 * -4 + (long)local_5a0.p;
                local_5c8 = (local_470 - lVar28) * local_5e8 + lVar34 + lVar20 * -4 +
                            (long)local_5a0.p;
                local_5a8 = (local_480 - lVar28) * local_5e8 + lVar34 + lVar20 * -4 +
                            (long)local_5a0.p;
                local_620 = local_470;
                local_618 = local_520;
                local_608 = local_480;
                do {
                  if ((int)uVar9 <= (int)uVar7) {
                    lVar25 = (long)local_660.begin.y;
                    lVar34 = (long)local_660.begin.z;
                    lVar21 = (long)local_660.begin.x * -8;
                    lVar32 = local_660.jstride * 8;
                    lVar28 = local_660.kstride * 8;
                    lVar20 = (local_618 - lVar34) * lVar28;
                    lVar16 = local_660.nstride * local_5d8;
                    lVar35 = (long)local_660.p +
                             (local_4d0 - lVar25) * lVar32 + lVar20 + lVar16 + local_428;
                    lVar31 = (long)local_660.p +
                             (local_4d8 - lVar25) * lVar32 + lVar20 + lVar16 + local_428;
                    lVar25 = (local_538 - lVar25) * lVar32;
                    lVar37 = lVar20 + lVar25 + lVar16;
                    lVar20 = (long)local_660.p + lVar37 + local_428;
                    lVar26 = (long)local_660.p +
                             (local_608 - lVar34) * lVar28 + lVar25 + lVar16 + local_428;
                    lVar29 = (long)local_660.p +
                             (local_620 - lVar34) * lVar28 + lVar25 + lVar16 + local_428;
                    lVar38 = (long)local_660.p + lVar37 + local_4a8;
                    lVar25 = local_5a8;
                    lVar28 = local_5e0;
                    lVar34 = local_600;
                    uVar19 = local_4b0;
                    lVar37 = local_5c8;
                    lVar16 = local_5f8;
                    do {
                      if (*(int *)(lVar34 + local_510 * 4) == 0) {
                        iVar27 = *(int *)(lVar16 + local_510 * 4);
                        iVar11 = *(int *)(lVar28 + local_510 * 4);
                        iVar15 = *(int *)(lVar37 + local_510 * 4);
                        iVar1 = *(int *)(lVar25 + local_510 * 4);
                        *(double *)(lVar20 + lVar21) =
                             ((double)iVar1 * *(double *)(lVar26 + lVar21) +
                             (double)iVar15 * *(double *)(lVar29 + lVar21) +
                             (double)iVar11 * *(double *)(lVar31 + lVar21) +
                             (double)iVar27 * *(double *)(lVar35 + lVar21) +
                             *(double *)(lVar38 + lVar21)) /
                             (double)(iVar1 + iVar27 + iVar11 + iVar15 + 1);
                      }
                      lVar35 = lVar35 + lVar32;
                      lVar16 = lVar16 + lVar36;
                      lVar31 = lVar31 + lVar32;
                      lVar28 = lVar28 + lVar36;
                      lVar34 = lVar34 + lVar36;
                      lVar37 = lVar37 + lVar36;
                      lVar25 = lVar25 + lVar36;
                      lVar20 = lVar20 + lVar32;
                      lVar26 = lVar26 + lVar32;
                      lVar29 = lVar29 + lVar32;
                      lVar38 = lVar38 + lVar32;
                      uVar17 = (int)uVar19 + 1;
                      uVar19 = (ulong)uVar17;
                    } while (uVar8 != uVar17);
                  }
                  local_618 = local_618 + 1;
                  local_5f8 = local_5f8 + local_5e8;
                  local_5e0 = local_5e0 + local_5e8;
                  local_600 = local_600 + local_5e8;
                  local_5c8 = local_5c8 + local_5e8;
                  local_5a8 = local_5a8 + local_5e8;
                  local_608 = local_608 + 1;
                  local_620 = local_620 + 1;
                } while (local_49c != (int)local_618);
              }
              if ((int)uVar24 <= (int)uVar6) {
                lVar20 = (long)local_5a0.begin.x;
                lVar34 = (long)local_5a0.begin.y;
                lVar28 = (long)local_5a0.begin.z;
                lVar36 = local_5a0.jstride * 4;
                local_5e8 = local_5a0.kstride * 4;
                lVar25 = (local_520 - lVar28) * local_5e8;
                local_5f8 = (local_4d0 - lVar34) * lVar36 + lVar25 + lVar20 * -4 + (long)local_5a0.p
                ;
                local_5e0 = (local_4d8 - lVar34) * lVar36 + lVar25 + lVar20 * -4 + (long)local_5a0.p
                ;
                lVar34 = (local_538 - lVar34) * lVar36;
                local_600 = lVar25 + lVar34 + lVar20 * -4 + (long)local_5a0.p;
                local_5c8 = (local_470 - lVar28) * local_5e8 + lVar34 + lVar20 * -4 +
                            (long)local_5a0.p;
                local_5a8 = (local_480 - lVar28) * local_5e8 + lVar34 + lVar20 * -4 +
                            (long)local_5a0.p;
                local_620 = local_470;
                local_618 = local_520;
                local_608 = local_480;
                do {
                  if ((int)uVar9 <= (int)uVar7) {
                    lVar25 = (long)local_660.begin.y;
                    lVar34 = (long)local_660.begin.z;
                    lVar21 = (long)local_660.begin.x * -8;
                    lVar32 = local_660.jstride * 8;
                    lVar28 = local_660.kstride * 8;
                    lVar20 = (local_618 - lVar34) * lVar28;
                    lVar16 = local_660.nstride * local_5d8;
                    lVar35 = (long)local_660.p +
                             (local_4d0 - lVar25) * lVar32 + lVar20 + lVar16 + local_340;
                    lVar31 = (long)local_660.p +
                             (local_4d8 - lVar25) * lVar32 + lVar20 + lVar16 + local_340;
                    lVar25 = (local_538 - lVar25) * lVar32;
                    lVar37 = lVar20 + lVar25 + lVar16;
                    lVar20 = (long)local_660.p + lVar37 + local_340;
                    lVar26 = (long)local_660.p +
                             (local_608 - lVar34) * lVar28 + lVar25 + lVar16 + local_340;
                    lVar29 = (long)local_660.p +
                             (local_620 - lVar34) * lVar28 + lVar25 + lVar16 + local_340;
                    lVar38 = (long)local_660.p + lVar37 + local_240;
                    lVar25 = local_5a8;
                    lVar28 = local_5e0;
                    lVar34 = local_600;
                    uVar19 = local_4b0;
                    lVar37 = local_5c8;
                    lVar16 = local_5f8;
                    do {
                      if (*(int *)(lVar34 + local_518 * 4) == 0) {
                        iVar27 = *(int *)(lVar16 + local_518 * 4);
                        iVar11 = *(int *)(lVar28 + local_518 * 4);
                        iVar15 = *(int *)(lVar37 + local_518 * 4);
                        iVar1 = *(int *)(lVar25 + local_518 * 4);
                        *(double *)(lVar20 + lVar21) =
                             ((double)iVar1 * *(double *)(lVar26 + lVar21) +
                             (double)iVar15 * *(double *)(lVar29 + lVar21) +
                             (double)iVar11 * *(double *)(lVar31 + lVar21) +
                             (double)iVar27 * *(double *)(lVar35 + lVar21) +
                             *(double *)(lVar38 + lVar21)) /
                             (double)(iVar1 + iVar27 + iVar11 + iVar15 + 1);
                      }
                      lVar35 = lVar35 + lVar32;
                      lVar16 = lVar16 + lVar36;
                      lVar31 = lVar31 + lVar32;
                      lVar28 = lVar28 + lVar36;
                      lVar34 = lVar34 + lVar36;
                      lVar37 = lVar37 + lVar36;
                      lVar25 = lVar25 + lVar36;
                      lVar20 = lVar20 + lVar32;
                      lVar26 = lVar26 + lVar32;
                      lVar29 = lVar29 + lVar32;
                      lVar38 = lVar38 + lVar32;
                      uVar17 = (int)uVar19 + 1;
                      uVar19 = (ulong)uVar17;
                    } while (uVar8 != uVar17);
                  }
                  local_618 = local_618 + 1;
                  local_5f8 = local_5f8 + local_5e8;
                  local_5e0 = local_5e0 + local_5e8;
                  local_600 = local_600 + local_5e8;
                  local_5c8 = local_5c8 + local_5e8;
                  local_5a8 = local_5a8 + local_5e8;
                  local_608 = local_608 + 1;
                  local_620 = local_620 + 1;
                } while (local_49c != (int)local_618);
              }
              if ((int)uVar24 <= (int)uVar6) {
                lVar25 = (long)local_5a0.begin.x;
                lVar28 = (long)local_5a0.begin.z;
                lVar20 = (local_530 - local_5a0.begin.y) * local_5a0.jstride;
                lVar16 = local_5a0.kstride * 4;
                lVar34 = (long)local_5a0.p +
                         (local_520 - lVar28) * lVar16 + lVar20 * 4 + lVar25 * -4 + local_3d0 + 4;
                lVar36 = (long)local_5a0.p +
                         (local_480 - lVar28) * lVar16 + lVar20 * 4 + lVar25 * -4 + local_3d0;
                lVar37 = (long)local_5a0.p +
                         (local_470 - lVar28) * lVar16 + lVar20 * 4 + lVar25 * -4 + local_3d0;
                lVar20 = local_470;
                lVar25 = local_480;
                lVar28 = local_520;
                do {
                  if ((int)uVar33 <= (int)uVar30) {
                    lVar31 = (long)local_660.begin.z;
                    lVar26 = local_660.kstride * 8;
                    lVar32 = (lVar28 - lVar31) * lVar26;
                    lVar29 = (local_530 - local_660.begin.y) * local_660.jstride * 8;
                    lVar35 = local_660.nstride * local_5d8;
                    lVar38 = (long)local_660.begin.x;
                    lVar21 = lVar32 + lVar29 + lVar35 + lVar38 * -8 + local_4a8;
                    lVar39 = 0;
                    do {
                      if (*(int *)(lVar34 + -4 + lVar39 * 4) == 0) {
                        iVar27 = *(int *)(lVar34 + -8 + lVar39 * 4);
                        iVar11 = *(int *)(lVar34 + lVar39 * 4);
                        iVar15 = *(int *)(lVar37 + lVar39 * 4);
                        iVar1 = *(int *)(lVar36 + lVar39 * 4);
                        *(double *)((long)local_660.p + lVar39 * 8 + lVar21) =
                             ((double)iVar1 *
                              *(double *)
                               ((long)local_660.p +
                               lVar39 * 8 +
                               (lVar25 - lVar31) * lVar26 + lVar29 + lVar35 + lVar38 * -8 +
                               local_4a8) +
                             (double)iVar15 *
                             *(double *)
                              ((long)local_660.p +
                              lVar39 * 8 +
                              (lVar20 - lVar31) * lVar26 + lVar29 + lVar35 + lVar38 * -8 + local_4a8
                              ) + (double)iVar27 *
                                  *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + -8) +
                                  (double)iVar11 *
                                  *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + 8) +
                                  *(double *)
                                   ((long)local_660.p +
                                   lVar39 * 8 +
                                   (local_538 - local_660.begin.y) * local_660.jstride * 8 + lVar32
                                   + lVar35 + lVar38 * -8 + local_4a8)) /
                             (double)(iVar1 + iVar27 + iVar11 + iVar15 + 1);
                      }
                      lVar39 = lVar39 + 1;
                    } while (uVar14 != (uint)lVar39);
                  }
                  lVar28 = lVar28 + 1;
                  lVar34 = lVar34 + lVar16;
                  lVar36 = lVar36 + lVar16;
                  lVar37 = lVar37 + lVar16;
                  lVar25 = lVar25 + 1;
                  lVar20 = lVar20 + 1;
                } while (local_49c != (int)lVar28);
              }
              if ((int)uVar24 <= (int)uVar6) {
                lVar25 = (long)local_5a0.begin.x;
                lVar28 = (long)local_5a0.begin.z;
                lVar20 = (local_468 - local_5a0.begin.y) * local_5a0.jstride;
                lVar16 = local_5a0.kstride * 4;
                lVar34 = (long)local_5a0.p +
                         (local_520 - lVar28) * lVar16 + lVar20 * 4 + lVar25 * -4 + local_3d0 + 4;
                lVar36 = (long)local_5a0.p +
                         (local_480 - lVar28) * lVar16 + lVar20 * 4 + lVar25 * -4 + local_3d0;
                lVar37 = (long)local_5a0.p +
                         (local_470 - lVar28) * lVar16 + lVar20 * 4 + lVar25 * -4 + local_3d0;
                lVar20 = local_470;
                lVar25 = local_480;
                lVar28 = local_520;
                do {
                  if ((int)uVar33 <= (int)uVar30) {
                    lVar31 = (long)local_660.begin.z;
                    lVar26 = local_660.kstride * 8;
                    lVar32 = (lVar28 - lVar31) * lVar26;
                    lVar29 = (local_468 - local_660.begin.y) * local_660.jstride * 8;
                    lVar35 = local_660.nstride * local_5d8;
                    lVar38 = (long)local_660.begin.x;
                    lVar21 = lVar32 + lVar29 + lVar35 + lVar38 * -8 + local_4a8;
                    lVar39 = 0;
                    do {
                      if (*(int *)(lVar34 + -4 + lVar39 * 4) == 0) {
                        iVar27 = *(int *)(lVar34 + -8 + lVar39 * 4);
                        iVar11 = *(int *)(lVar34 + lVar39 * 4);
                        iVar15 = *(int *)(lVar37 + lVar39 * 4);
                        iVar1 = *(int *)(lVar36 + lVar39 * 4);
                        *(double *)((long)local_660.p + lVar39 * 8 + lVar21) =
                             ((double)iVar1 *
                              *(double *)
                               ((long)local_660.p +
                               lVar39 * 8 +
                               (lVar25 - lVar31) * lVar26 + lVar29 + lVar35 + lVar38 * -8 +
                               local_4a8) +
                             (double)iVar15 *
                             *(double *)
                              ((long)local_660.p +
                              lVar39 * 8 +
                              (lVar20 - lVar31) * lVar26 + lVar29 + lVar35 + lVar38 * -8 + local_4a8
                              ) + (double)iVar27 *
                                  *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + -8) +
                                  (double)iVar11 *
                                  *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + 8) +
                                  *(double *)
                                   ((long)local_660.p +
                                   lVar39 * 8 +
                                   (local_4c8 - local_660.begin.y) * local_660.jstride * 8 + lVar32
                                   + lVar35 + lVar38 * -8 + local_4a8)) /
                             (double)(iVar1 + iVar27 + iVar11 + iVar15 + 1);
                      }
                      lVar39 = lVar39 + 1;
                    } while (uVar14 != (uint)lVar39);
                  }
                  lVar28 = lVar28 + 1;
                  lVar34 = lVar34 + lVar16;
                  lVar36 = lVar36 + lVar16;
                  lVar37 = lVar37 + lVar16;
                  lVar25 = lVar25 + 1;
                  lVar20 = lVar20 + 1;
                } while (local_49c != (int)lVar28);
              }
              if ((int)uVar9 <= (int)uVar7) {
                lVar25 = (long)local_5a0.begin.x;
                lVar20 = (long)local_5a0.begin.y;
                lVar28 = (local_508 - local_5a0.begin.z) * local_5a0.kstride;
                lVar16 = local_5a0.jstride * 4;
                lVar34 = (long)local_5a0.p +
                         (local_538 - lVar20) * lVar16 + lVar28 * 4 + lVar25 * -4 + local_3d0 + 4;
                lVar36 = (long)local_5a0.p +
                         (local_4d0 - lVar20) * lVar16 + lVar28 * 4 + lVar25 * -4 + local_3d0;
                lVar37 = (long)local_5a0.p +
                         (local_4d8 - lVar20) * lVar16 + lVar28 * 4 + lVar25 * -4 + local_3d0;
                lVar20 = local_4d8;
                lVar25 = local_4d0;
                lVar28 = local_538;
                do {
                  if ((int)uVar33 <= (int)uVar30) {
                    lVar31 = (long)local_660.begin.y;
                    lVar26 = (local_508 - local_660.begin.z) * local_660.kstride * 8;
                    lVar29 = local_660.jstride * 8;
                    lVar32 = (lVar28 - lVar31) * lVar29;
                    lVar35 = local_660.nstride * local_5d8;
                    lVar38 = (long)local_660.begin.x;
                    lVar21 = lVar32 + lVar26 + lVar35 + lVar38 * -8 + local_4a8;
                    lVar39 = 0;
                    do {
                      if (*(int *)(lVar34 + -4 + lVar39 * 4) == 0) {
                        iVar27 = *(int *)(lVar34 + -8 + lVar39 * 4);
                        iVar11 = *(int *)(lVar34 + lVar39 * 4);
                        iVar15 = *(int *)(lVar36 + lVar39 * 4);
                        iVar1 = *(int *)(lVar37 + lVar39 * 4);
                        *(double *)((long)local_660.p + lVar39 * 8 + lVar21) =
                             ((double)iVar1 *
                              *(double *)
                               ((long)local_660.p +
                               lVar39 * 8 +
                               (lVar20 - lVar31) * lVar29 + lVar26 + lVar35 + lVar38 * -8 +
                               local_4a8) +
                              (double)iVar15 *
                              *(double *)
                               ((long)local_660.p +
                               lVar39 * 8 +
                               (lVar25 - lVar31) * lVar29 + lVar26 + lVar35 + lVar38 * -8 +
                               local_4a8) +
                              (double)iVar27 *
                              *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + -8) +
                              (double)iVar11 *
                              *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + 8) +
                             *(double *)
                              ((long)local_660.p +
                              lVar39 * 8 +
                              (local_520 - local_660.begin.z) * local_660.kstride * 8 + lVar32 +
                              lVar35 + lVar38 * -8 + local_4a8)) /
                             (double)(iVar1 + iVar27 + iVar11 + iVar15 + 1);
                      }
                      lVar39 = lVar39 + 1;
                    } while (uVar14 != (uint)lVar39);
                  }
                  lVar28 = lVar28 + 1;
                  lVar34 = lVar34 + lVar16;
                  lVar36 = lVar36 + lVar16;
                  lVar37 = lVar37 + lVar16;
                  lVar25 = lVar25 + 1;
                  lVar20 = lVar20 + 1;
                } while (local_3ec != (int)lVar28);
              }
              if ((int)uVar9 <= (int)uVar7) {
                lVar25 = (long)local_5a0.begin.x;
                lVar20 = (long)local_5a0.begin.y;
                lVar28 = (local_460 - local_5a0.begin.z) * local_5a0.kstride;
                lVar16 = local_5a0.jstride * 4;
                lVar34 = (long)local_5a0.p +
                         (local_538 - lVar20) * lVar16 + lVar28 * 4 + lVar25 * -4 + local_3d0 + 4;
                lVar36 = (long)local_5a0.p +
                         (local_4d0 - lVar20) * lVar16 + lVar28 * 4 + lVar25 * -4 + local_3d0;
                lVar37 = (long)local_5a0.p +
                         (local_4d8 - lVar20) * lVar16 + lVar28 * 4 + lVar25 * -4 + local_3d0;
                lVar20 = local_4d8;
                lVar25 = local_4d0;
                lVar28 = local_538;
                do {
                  if ((int)uVar33 <= (int)uVar30) {
                    lVar31 = (long)local_660.begin.y;
                    lVar26 = (local_460 - local_660.begin.z) * local_660.kstride * 8;
                    lVar29 = local_660.jstride * 8;
                    lVar32 = (lVar28 - lVar31) * lVar29;
                    lVar35 = local_660.nstride * local_5d8;
                    lVar38 = (long)local_660.begin.x;
                    lVar21 = lVar32 + lVar26 + lVar35 + lVar38 * -8 + local_4a8;
                    lVar39 = 0;
                    do {
                      if (*(int *)(lVar34 + -4 + lVar39 * 4) == 0) {
                        iVar27 = *(int *)(lVar34 + -8 + lVar39 * 4);
                        iVar11 = *(int *)(lVar34 + lVar39 * 4);
                        iVar15 = *(int *)(lVar36 + lVar39 * 4);
                        iVar1 = *(int *)(lVar37 + lVar39 * 4);
                        *(double *)((long)local_660.p + lVar39 * 8 + lVar21) =
                             ((double)iVar1 *
                              *(double *)
                               ((long)local_660.p +
                               lVar39 * 8 +
                               (lVar20 - lVar31) * lVar29 + lVar26 + lVar35 + lVar38 * -8 +
                               local_4a8) +
                              (double)iVar15 *
                              *(double *)
                               ((long)local_660.p +
                               lVar39 * 8 +
                               (lVar25 - lVar31) * lVar29 + lVar26 + lVar35 + lVar38 * -8 +
                               local_4a8) +
                              (double)iVar27 *
                              *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + -8) +
                              (double)iVar11 *
                              *(double *)((long)local_660.p + lVar39 * 8 + lVar21 + 8) +
                             *(double *)
                              ((long)local_660.p +
                              lVar39 * 8 +
                              (local_4e0 - local_660.begin.z) * local_660.kstride * 8 + lVar32 +
                              lVar35 + lVar38 * -8 + local_4a8)) /
                             (double)(iVar1 + iVar27 + iVar11 + iVar15 + 1);
                      }
                      lVar39 = lVar39 + 1;
                    } while (uVar14 != (uint)lVar39);
                  }
                  lVar28 = lVar28 + 1;
                  lVar34 = lVar34 + lVar16;
                  lVar36 = lVar36 + lVar16;
                  lVar37 = lVar37 + lVar16;
                  lVar25 = lVar25 + 1;
                  lVar20 = lVar20 + 1;
                } while (local_3ec != (int)lVar28);
              }
              local_5d0 = local_5d0 + 1;
              local_5d8 = local_5d8 + 8;
            } while (local_5d0 != local_250);
          }
          MFIter::operator++((MFIter *)local_218);
        } while ((int)local_208.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage < local_1f0);
      }
      MFIter::~MFIter((MFIter *)local_218);
      uVar8 = (int)local_3c0 + 1;
      local_3c0 = (ulong)uVar8;
      local_3a8 = (ulong)((int)local_3a8 - 1);
      local_3b0 = (ulong)((int)local_3b0 - 1);
      local_3b8 = (ulong)((int)local_3b8 + 1);
      local_4f0 = (ulong)((int)local_4f0 + 2);
    } while (uVar8 != local_3f4);
  }
  iMultiFab::~iMultiFab((iMultiFab *)&local_1b0);
  return;
}

Assistant:

void FirstOrderExtrap (MultiFab& mf, const Geometry& geom, int scomp, int ncomp, int ngrow)
    {
        BL_ASSERT(mf.nGrow() >= ngrow);
        BL_ASSERT(scomp >= 0);
        BL_ASSERT((scomp+ncomp) <= mf.nComp());

        iMultiFab mask(mf.boxArray(), mf.DistributionMap(), 1, ngrow, MFInfo(),
                       DefaultFabFactory<IArrayBox>());
        mask.BuildMask(geom.Domain(), geom.periodicity(),
                       finebnd, crsebnd, physbnd, interior);

        // Do the extrap. on successive layers of ghost cells
        for (int layer = 0; layer < ngrow; layer++) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf); mfi.isValid(); ++mfi)
            {
                const Box& bx        = mfi.validbox();
                const Box& gbx       = amrex::grow(bx,layer);
                auto const& mask_arr = mask.const_array(mfi);
                auto const& data_arr = mf.array(mfi,scomp);

                if (Gpu::inLaunchRegion()) {
                    // set the crse cell to zero in the current layer
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       if (!gbx.contains(i,j,k)) {
                           if (mask_arr(i,j,k) == crsebnd) data_arr(i,j,k,n) = 0.0;
                       }
                    });
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       amrex_first_order_extrap_gpu(i, j, k, n, bx, mask_arr, data_arr);
                    });
                } else {
                    amrex_first_order_extrap_cpu(gbx, ncomp, mask_arr, data_arr);
                }
            }
        }
    }